

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  RTCRayQueryFlags *pRVar1;
  float *pfVar2;
  RTCRayQueryFlags *pRVar3;
  float *pfVar4;
  RTCRayQueryFlags *pRVar5;
  float *pfVar6;
  RTCRayQueryFlags *pRVar7;
  float *pfVar8;
  Primitive *pPVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 uVar20;
  Primitive PVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  Geometry *pGVar29;
  __int_type_conflict _Var30;
  long lVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined6 uVar86;
  undefined1 auVar87 [12];
  unkbyte9 Var88;
  undefined1 auVar89 [13];
  undefined1 auVar90 [12];
  undefined1 auVar91 [13];
  undefined1 auVar92 [12];
  undefined1 auVar93 [13];
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined1 auVar98 [13];
  undefined1 auVar99 [12];
  undefined1 auVar100 [13];
  undefined1 auVar101 [12];
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [12];
  undefined1 auVar107 [12];
  undefined1 auVar108 [12];
  undefined1 auVar109 [12];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [13];
  undefined1 auVar125 [13];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  vfloat_impl<4> vVar128;
  undefined4 uVar129;
  ulong uVar130;
  StackEntry *pSVar131;
  RTCRayN *pRVar132;
  RTCRayN *extraout_RAX;
  RTCRayN *extraout_RAX_00;
  undefined4 uVar134;
  RTCIntersectArguments *pRVar135;
  RTCIntersectArguments *pRVar136;
  RTCIntersectArguments *extraout_RDX;
  RTCIntersectArguments *extraout_RDX_00;
  RTCIntersectArguments *extraout_RDX_01;
  RTCIntersectArguments *pRVar137;
  RTCIntersectArguments *extraout_RDX_02;
  RTCIntersectArguments *extraout_RDX_03;
  RTCIntersectArguments *extraout_RDX_04;
  RTCIntersectArguments *pRVar138;
  RTCIntersectArguments *pRVar139;
  long lVar140;
  long lVar141;
  bool bVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  uint uVar148;
  uint uVar149;
  uint uVar150;
  char cVar151;
  short sVar152;
  char cVar199;
  undefined1 uVar202;
  undefined2 uVar201;
  int iVar153;
  undefined1 auVar155 [12];
  undefined1 uVar200;
  int iVar203;
  __m128 a_1;
  char cVar206;
  undefined1 auVar157 [16];
  undefined1 auVar160 [16];
  undefined1 auVar156 [12];
  undefined1 auVar164 [16];
  float fVar207;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 uVar246;
  float pp;
  float fVar208;
  float fVar209;
  undefined8 uVar210;
  float fVar249;
  undefined1 auVar211 [16];
  float fVar247;
  float fVar248;
  float fVar250;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  char cVar251;
  char cVar258;
  float s;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar259;
  float fVar260;
  char cVar278;
  float fVar279;
  float fVar282;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar280;
  float fVar283;
  float fVar285;
  float fVar286;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar281;
  float fVar284;
  float fVar287;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar288;
  undefined1 auVar289 [12];
  float fVar313;
  float fVar314;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar290 [12];
  undefined1 auVar296 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar315;
  float fVar316;
  undefined1 auVar319 [12];
  float fVar344;
  undefined1 auVar323 [16];
  undefined1 auVar327 [16];
  undefined1 auVar320 [12];
  undefined1 auVar331 [16];
  undefined1 auVar321 [12];
  undefined1 auVar335 [16];
  float fVar348;
  float fVar350;
  float fVar352;
  undefined1 auVar338 [16];
  float fVar317;
  float fVar349;
  float fVar351;
  float fVar353;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  float fVar354;
  float fVar355;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar370;
  undefined1 auVar356 [16];
  uint uVar369;
  uint uVar371;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar363 [16];
  undefined1 auVar365 [16];
  float fVar378;
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  float fVar379;
  float fVar398;
  undefined1 auVar380 [12];
  undefined1 auVar382 [16];
  undefined1 auVar381 [12];
  undefined1 auVar386 [16];
  undefined1 auVar390 [16];
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar404;
  float fVar405;
  undefined1 auVar391 [16];
  float fVar403;
  float fVar406;
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar394;
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  float fVar407;
  float fVar412;
  float fVar414;
  undefined1 auVar408 [16];
  float fVar413;
  float fVar415;
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  float fVar416;
  float fVar420;
  float fVar422;
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  float fVar421;
  float fVar423;
  undefined1 auVar419 [16];
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar431;
  float fVar435;
  vfloat4 a;
  float fVar432;
  float fVar436;
  float fVar439;
  undefined1 auVar428 [16];
  float fVar433;
  float fVar434;
  float fVar437;
  float fVar438;
  float fVar440;
  float fVar441;
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  float fVar442;
  float fVar443;
  float fVar447;
  float fVar449;
  undefined1 auVar444 [16];
  float fVar448;
  float fVar450;
  float fVar451;
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  float fVar452;
  float fVar459;
  float fVar462;
  float fVar465;
  undefined1 auVar455 [16];
  float fVar453;
  float fVar454;
  float fVar460;
  float fVar461;
  float fVar463;
  float fVar464;
  float fVar466;
  float fVar467;
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  float fVar468;
  float fVar469;
  float fVar470;
  float fVar471;
  float fVar472;
  float fVar473;
  float fVar478;
  float fVar479;
  float fVar480;
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar477;
  char local_628;
  char cStack_627;
  undefined1 uStack_626;
  undefined1 uStack_625;
  float local_60c;
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  undefined8 local_5b8;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  short local_588;
  undefined2 uStack_586;
  undefined2 uStack_584;
  undefined2 uStack_582;
  RTCFilterFunctionNArguments args;
  int local_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined4 local_4f8;
  undefined4 uStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  vfloatx vu0;
  undefined1 local_388 [16];
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  Primitive *local_348;
  ulong local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  float local_108 [4];
  StackEntry stack [4];
  ulong uVar133;
  undefined1 auVar154 [12];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  int iVar204;
  int iVar205;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar293 [16];
  undefined1 auVar297 [16];
  undefined1 auVar306 [16];
  undefined1 auVar310 [16];
  undefined1 auVar294 [16];
  undefined1 auVar298 [16];
  undefined1 auVar295 [16];
  undefined1 auVar299 [16];
  undefined1 auVar318 [12];
  undefined1 auVar324 [16];
  undefined1 auVar328 [16];
  undefined1 auVar332 [16];
  undefined1 auVar336 [16];
  undefined1 auVar322 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar337 [16];
  int iVar345;
  int iVar346;
  int iVar347;
  undefined1 auVar362 [16];
  undefined1 auVar364 [16];
  undefined1 auVar383 [16];
  undefined1 auVar387 [16];
  undefined1 auVar384 [16];
  undefined1 auVar388 [16];
  undefined1 auVar385 [16];
  undefined1 auVar389 [16];
  
  PVar21 = prim[1];
  uVar130 = (ulong)(byte)PVar21;
  lVar140 = uVar130 * 0x25;
  uVar134 = *(undefined4 *)(prim + uVar130 * 4 + 6);
  uVar129 = *(undefined4 *)(prim + uVar130 * 5 + 6);
  uVar22 = *(undefined4 *)(prim + uVar130 * 6 + 6);
  uVar23 = *(undefined4 *)(prim + uVar130 * 0xf + 6);
  uVar24 = *(undefined4 *)(prim + (ulong)(byte)PVar21 * 0x10 + 6);
  uVar25 = *(undefined4 *)(prim + uVar130 * 0x11 + 6);
  uVar26 = *(undefined4 *)(prim + uVar130 * 0x1a + 6);
  uVar27 = *(undefined4 *)(prim + uVar130 * 0x1b + 6);
  pPVar9 = prim + lVar140 + 6;
  fVar435 = *(float *)(pPVar9 + 0xc);
  fVar288 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar9) * fVar435;
  fVar313 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar9 + 4)) * fVar435;
  fVar314 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar9 + 8)) * fVar435;
  fVar424 = fVar435 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar431 = fVar435 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar435 = fVar435 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar28 = *(undefined4 *)(prim + uVar130 * 0x1c + 6);
  uVar202 = (undefined1)((uint)uVar26 >> 0x18);
  uVar201 = CONCAT11((char)((uint)uVar129 >> 0x18),uVar202);
  uVar200 = (undefined1)((uint)uVar26 >> 0x10);
  uVar210 = CONCAT35(CONCAT21(uVar201,(char)((uint)uVar129 >> 0x10)),CONCAT14(uVar200,uVar26));
  cVar258 = (char)((uint)uVar129 >> 8);
  cVar199 = (char)((uint)uVar26 >> 8);
  uVar86 = CONCAT51(CONCAT41((int)((ulong)uVar210 >> 0x20),cVar258),cVar199);
  cVar151 = (char)uVar26;
  cVar251 = (char)uVar129;
  uVar133 = CONCAT62(uVar86,CONCAT11(cVar251,cVar151));
  auVar340._8_4_ = 0;
  auVar340._0_8_ = uVar133;
  auVar340._12_2_ = uVar201;
  auVar340._14_2_ = uVar201;
  uVar201 = (undefined2)((ulong)uVar210 >> 0x20);
  auVar262._12_4_ = auVar340._12_4_;
  auVar262._8_2_ = 0;
  auVar262._0_8_ = uVar133;
  auVar262._10_2_ = uVar201;
  auVar168._10_6_ = auVar262._10_6_;
  auVar168._8_2_ = uVar201;
  auVar168._0_8_ = uVar133;
  uVar201 = (undefined2)uVar86;
  auVar87._4_8_ = auVar168._8_8_;
  auVar87._2_2_ = uVar201;
  auVar87._0_2_ = uVar201;
  iVar153 = (int)CONCAT11(cVar251,cVar151) >> 8;
  iVar203 = auVar87._0_4_ >> 0x18;
  auVar154._0_8_ = CONCAT44(iVar203,iVar153);
  auVar154._8_4_ = auVar168._8_4_ >> 0x18;
  auVar373._12_4_ = auVar262._12_4_ >> 0x18;
  auVar373._0_12_ = auVar154;
  fVar366 = (float)iVar203;
  cVar206 = cVar258 >> 7;
  auVar35[0xd] = 0;
  auVar35._0_13_ = auVar373._0_13_;
  auVar35[0xe] = cVar206;
  auVar40[0xc] = cVar206;
  auVar40._0_12_ = auVar154;
  auVar40._13_2_ = auVar35._13_2_;
  auVar45[0xb] = 0;
  auVar45._0_11_ = auVar154._0_11_;
  auVar45._12_3_ = auVar40._12_3_;
  auVar50[10] = cVar206;
  auVar50._0_10_ = auVar154._0_10_;
  auVar50._11_4_ = auVar45._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar154._0_9_;
  auVar55._10_5_ = auVar50._10_5_;
  auVar60[8] = cVar258;
  auVar60._0_8_ = auVar154._0_8_;
  auVar60._9_6_ = auVar55._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar251 >> 7);
  auVar65._6_9_ = Var88;
  auVar65[5] = (char)((uint)uVar22 >> 0x10);
  auVar65[4] = (undefined1)((short)cVar251 >> 7);
  auVar65._0_4_ = iVar153;
  cVar278 = (char)((uint)uVar22 >> 8);
  auVar89._2_11_ = auVar65._4_11_;
  auVar89[1] = cVar278;
  auVar89[0] = (undefined1)((short)cVar251 >> 7);
  cVar258 = (char)uVar22;
  auVar70._2_13_ = auVar89;
  auVar70._0_2_ = CONCAT11(cVar258,cVar251);
  uVar201 = (undefined2)Var88;
  auVar158._0_12_ = auVar70._0_12_;
  auVar158._12_2_ = uVar201;
  auVar158._14_2_ = uVar201;
  auVar457._12_4_ = auVar158._12_4_;
  auVar457._0_10_ = auVar70._0_10_;
  auVar457._10_2_ = auVar65._4_2_;
  auVar157._10_6_ = auVar457._10_6_;
  auVar157._0_8_ = auVar70._0_8_;
  auVar157._8_2_ = auVar65._4_2_;
  auVar90._4_8_ = auVar157._8_8_;
  auVar90._2_2_ = auVar89._0_2_;
  auVar90._0_2_ = auVar89._0_2_;
  iVar203 = (int)CONCAT11(cVar258,cVar251) >> 8;
  iVar204 = auVar90._0_4_ >> 0x18;
  auVar155._0_8_ = CONCAT44(iVar204,iVar203);
  auVar155._8_4_ = auVar157._8_4_ >> 0x18;
  auVar159._12_4_ = auVar457._12_4_ >> 0x18;
  auVar159._0_12_ = auVar155;
  fVar398 = (float)iVar204;
  cVar206 = cVar278 >> 7;
  auVar36[0xd] = 0;
  auVar36._0_13_ = auVar159._0_13_;
  auVar36[0xe] = cVar206;
  auVar41[0xc] = cVar206;
  auVar41._0_12_ = auVar155;
  auVar41._13_2_ = auVar36._13_2_;
  auVar46[0xb] = 0;
  auVar46._0_11_ = auVar155._0_11_;
  auVar46._12_3_ = auVar41._12_3_;
  auVar51[10] = cVar206;
  auVar51._0_10_ = auVar155._0_10_;
  auVar51._11_4_ = auVar46._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar155._0_9_;
  auVar56._10_5_ = auVar51._10_5_;
  auVar61[8] = cVar278;
  auVar61._0_8_ = auVar155._0_8_;
  auVar61._9_6_ = auVar56._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar258 >> 7);
  auVar66._6_9_ = Var88;
  auVar66[5] = (char)((uint)uVar24 >> 0x10);
  auVar66[4] = (undefined1)((short)cVar258 >> 7);
  auVar66._0_4_ = iVar203;
  cVar278 = (char)((uint)uVar24 >> 8);
  auVar91._2_11_ = auVar66._4_11_;
  auVar91[1] = cVar278;
  auVar91[0] = (undefined1)((short)cVar258 >> 7);
  cVar251 = (char)uVar24;
  auVar71._2_13_ = auVar91;
  auVar71._0_2_ = CONCAT11(cVar251,cVar258);
  uVar201 = (undefined2)Var88;
  auVar162._0_12_ = auVar71._0_12_;
  auVar162._12_2_ = uVar201;
  auVar162._14_2_ = uVar201;
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._0_10_ = auVar71._0_10_;
  auVar161._10_2_ = auVar66._4_2_;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160._0_8_ = auVar71._0_8_;
  auVar160._8_2_ = auVar66._4_2_;
  auVar92._4_8_ = auVar160._8_8_;
  auVar92._2_2_ = auVar91._0_2_;
  auVar92._0_2_ = auVar91._0_2_;
  iVar204 = (int)CONCAT11(cVar251,cVar258) >> 8;
  iVar205 = auVar92._0_4_ >> 0x18;
  auVar156._0_8_ = CONCAT44(iVar205,iVar204);
  auVar156._8_4_ = auVar160._8_4_ >> 0x18;
  auVar163._12_4_ = auVar161._12_4_ >> 0x18;
  auVar163._0_12_ = auVar156;
  fVar378 = (float)iVar205;
  cVar206 = cVar278 >> 7;
  auVar37[0xd] = 0;
  auVar37._0_13_ = auVar163._0_13_;
  auVar37[0xe] = cVar206;
  auVar42[0xc] = cVar206;
  auVar42._0_12_ = auVar156;
  auVar42._13_2_ = auVar37._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar156._0_11_;
  auVar47._12_3_ = auVar42._12_3_;
  auVar52[10] = cVar206;
  auVar52._0_10_ = auVar156._0_10_;
  auVar52._11_4_ = auVar47._11_4_;
  auVar57[9] = 0;
  auVar57._0_9_ = auVar156._0_9_;
  auVar57._10_5_ = auVar52._10_5_;
  auVar62[8] = cVar278;
  auVar62._0_8_ = auVar156._0_8_;
  auVar62._9_6_ = auVar57._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar25 >> 0x18)),(short)cVar251 >> 7);
  auVar67._6_9_ = Var88;
  auVar67[5] = (char)((uint)uVar25 >> 0x10);
  auVar67[4] = (undefined1)((short)cVar251 >> 7);
  auVar67._0_4_ = iVar204;
  auVar93._2_11_ = auVar67._4_11_;
  auVar93[1] = (char)((uint)uVar25 >> 8);
  auVar93[0] = (undefined1)((short)cVar251 >> 7);
  sVar152 = CONCAT11((char)uVar25,cVar251);
  auVar72._2_13_ = auVar93;
  auVar72._0_2_ = sVar152;
  uVar201 = (undefined2)Var88;
  auVar166._0_12_ = auVar72._0_12_;
  auVar166._12_2_ = uVar201;
  auVar166._14_2_ = uVar201;
  auVar165._12_4_ = auVar166._12_4_;
  auVar165._0_10_ = auVar72._0_10_;
  auVar165._10_2_ = auVar67._4_2_;
  auVar164._10_6_ = auVar165._10_6_;
  auVar164._0_8_ = auVar72._0_8_;
  auVar164._8_2_ = auVar67._4_2_;
  auVar94._4_8_ = auVar164._8_8_;
  auVar94._2_2_ = auVar93._0_2_;
  auVar94._0_2_ = auVar93._0_2_;
  fVar442 = (float)((int)sVar152 >> 8);
  fVar447 = (float)(auVar94._0_4_ >> 0x18);
  fVar449 = (float)(auVar164._8_4_ >> 0x18);
  fVar315 = fVar435 * fVar442;
  fVar344 = fVar435 * fVar447;
  auVar318._0_8_ = CONCAT44(fVar344,fVar315);
  auVar318._8_4_ = fVar435 * fVar449;
  auVar322._12_4_ = fVar435 * (float)(auVar165._12_4_ >> 0x18);
  auVar322._0_12_ = auVar318;
  fVar468 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar140 + 0x16)) *
            *(float *)(prim + lVar140 + 0x1a);
  local_628 = (char)uVar134;
  cStack_627 = (char)((uint)uVar134 >> 8);
  uStack_626 = (undefined1)((uint)uVar134 >> 0x10);
  uStack_625 = (undefined1)((uint)uVar134 >> 0x18);
  auVar110[0xd] = 0;
  auVar110._0_13_ = auVar322._0_13_;
  auVar110[0xe] = (char)((uint)fVar344 >> 0x18);
  auVar112[0xc] = (char)((uint)fVar344 >> 0x10);
  auVar112._0_12_ = auVar318;
  auVar112._13_2_ = auVar110._13_2_;
  auVar114[0xb] = 0;
  auVar114._0_11_ = auVar318._0_11_;
  auVar114._12_3_ = auVar112._12_3_;
  auVar116[10] = (char)((uint)fVar344 >> 8);
  auVar116._0_10_ = auVar318._0_10_;
  auVar116._11_4_ = auVar114._11_4_;
  auVar118[9] = 0;
  auVar118._0_9_ = auVar318._0_9_;
  auVar118._10_5_ = auVar116._10_5_;
  auVar120[8] = SUB41(fVar344,0);
  auVar120._0_8_ = auVar318._0_8_;
  auVar120._9_6_ = auVar118._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar120._8_7_,uStack_625),(char)((uint)fVar315 >> 0x18));
  auVar122._6_9_ = Var88;
  auVar122[5] = uStack_626;
  auVar122[4] = (char)((uint)fVar315 >> 0x10);
  auVar122._0_4_ = fVar315;
  auVar124._2_11_ = auVar122._4_11_;
  auVar124[1] = cStack_627;
  auVar124[0] = (char)((uint)fVar315 >> 8);
  sVar152 = CONCAT11(local_628,SUB41(fVar315,0));
  auVar126._2_13_ = auVar124;
  auVar126._0_2_ = sVar152;
  uVar201 = (undefined2)Var88;
  auVar325._0_12_ = auVar126._0_12_;
  auVar325._12_2_ = uVar201;
  auVar325._14_2_ = uVar201;
  auVar324._12_4_ = auVar325._12_4_;
  auVar324._0_10_ = auVar126._0_10_;
  auVar324._10_2_ = auVar122._4_2_;
  auVar323._10_6_ = auVar324._10_6_;
  auVar323._0_8_ = auVar126._0_8_;
  auVar323._8_2_ = auVar122._4_2_;
  auVar95._4_8_ = auVar323._8_8_;
  auVar95._2_2_ = auVar124._0_2_;
  auVar95._0_2_ = auVar124._0_2_;
  iVar205 = (int)sVar152 >> 8;
  iVar345 = auVar95._0_4_ >> 0x18;
  auVar319._0_8_ = CONCAT44(iVar345,iVar205);
  auVar319._8_4_ = auVar323._8_4_ >> 0x18;
  auVar326._12_4_ = auVar324._12_4_ >> 0x18;
  auVar326._0_12_ = auVar319;
  fVar279 = (float)iVar345;
  uVar246 = (undefined1)((uint)uVar23 >> 0x18);
  uVar201 = CONCAT11(uVar246,uVar246);
  uVar246 = (undefined1)((uint)uVar23 >> 0x10);
  uVar210 = CONCAT35(CONCAT21(uVar201,uVar246),CONCAT14(uVar246,uVar23));
  uVar246 = (undefined1)((uint)uVar23 >> 8);
  uVar86 = CONCAT51(CONCAT41((int)((ulong)uVar210 >> 0x20),uVar246),uVar246);
  sVar152 = CONCAT11((char)uVar23,(char)uVar23);
  uVar133 = CONCAT62(uVar86,sVar152);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar133;
  auVar213._12_2_ = uVar201;
  auVar213._14_2_ = uVar201;
  uVar201 = (undefined2)((ulong)uVar210 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar133;
  auVar212._10_2_ = uVar201;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar201;
  auVar211._0_8_ = uVar133;
  uVar201 = (undefined2)uVar86;
  auVar96._4_8_ = auVar211._8_8_;
  auVar96._2_2_ = uVar201;
  auVar96._0_2_ = uVar201;
  fVar208 = (float)((int)sVar152 >> 8);
  fVar247 = (float)(auVar96._0_4_ >> 0x18);
  fVar249 = (float)(auVar211._8_4_ >> 0x18);
  cVar206 = cStack_627 >> 7;
  auVar111[0xd] = 0;
  auVar111._0_13_ = auVar326._0_13_;
  auVar111[0xe] = cVar206;
  auVar113[0xc] = cVar206;
  auVar113._0_12_ = auVar319;
  auVar113._13_2_ = auVar111._13_2_;
  auVar115[0xb] = 0;
  auVar115._0_11_ = auVar319._0_11_;
  auVar115._12_3_ = auVar113._12_3_;
  auVar117[10] = cVar206;
  auVar117._0_10_ = auVar319._0_10_;
  auVar117._11_4_ = auVar115._11_4_;
  auVar119[9] = 0;
  auVar119._0_9_ = auVar319._0_9_;
  auVar119._10_5_ = auVar117._10_5_;
  auVar121[8] = cStack_627;
  auVar121._0_8_ = auVar319._0_8_;
  auVar121._9_6_ = auVar119._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar121._8_7_,uVar202),(short)local_628 >> 7);
  auVar123._6_9_ = Var88;
  auVar123[5] = uVar200;
  auVar123[4] = (undefined1)((short)local_628 >> 7);
  auVar123._0_4_ = iVar205;
  auVar125._2_11_ = auVar123._4_11_;
  auVar125[1] = cVar199;
  auVar125[0] = (undefined1)((short)local_628 >> 7);
  auVar127._2_13_ = auVar125;
  auVar127._0_2_ = CONCAT11(cVar151,local_628);
  uVar201 = (undefined2)Var88;
  auVar329._0_12_ = auVar127._0_12_;
  auVar329._12_2_ = uVar201;
  auVar329._14_2_ = uVar201;
  auVar328._12_4_ = auVar329._12_4_;
  auVar328._0_10_ = auVar127._0_10_;
  auVar328._10_2_ = auVar123._4_2_;
  auVar327._10_6_ = auVar328._10_6_;
  auVar327._0_8_ = auVar127._0_8_;
  auVar327._8_2_ = auVar123._4_2_;
  auVar97._4_8_ = auVar327._8_8_;
  auVar97._2_2_ = auVar125._0_2_;
  auVar97._0_2_ = auVar125._0_2_;
  iVar345 = (int)CONCAT11(cVar151,local_628) >> 8;
  iVar346 = auVar97._0_4_ >> 0x18;
  auVar320._0_8_ = CONCAT44(iVar346,iVar345);
  auVar320._8_4_ = auVar327._8_4_ >> 0x18;
  auVar330._12_4_ = auVar328._12_4_ >> 0x18;
  auVar330._0_12_ = auVar320;
  fVar412 = (float)iVar346;
  cVar206 = cVar199 >> 7;
  auVar38[0xd] = 0;
  auVar38._0_13_ = auVar330._0_13_;
  auVar38[0xe] = cVar206;
  auVar43[0xc] = cVar206;
  auVar43._0_12_ = auVar320;
  auVar43._13_2_ = auVar38._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar320._0_11_;
  auVar48._12_3_ = auVar43._12_3_;
  auVar53[10] = cVar206;
  auVar53._0_10_ = auVar320._0_10_;
  auVar53._11_4_ = auVar48._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar320._0_9_;
  auVar58._10_5_ = auVar53._10_5_;
  auVar63[8] = cVar199;
  auVar63._0_8_ = auVar320._0_8_;
  auVar63._9_6_ = auVar58._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar63._8_7_,(char)((uint)uVar27 >> 0x18)),(short)cVar151 >> 7);
  auVar68._6_9_ = Var88;
  auVar68[5] = (char)((uint)uVar27 >> 0x10);
  auVar68[4] = (undefined1)((short)cVar151 >> 7);
  auVar68._0_4_ = iVar345;
  cVar206 = (char)((uint)uVar27 >> 8);
  auVar98._2_11_ = auVar68._4_11_;
  auVar98[1] = cVar206;
  auVar98[0] = (undefined1)((short)cVar151 >> 7);
  cVar199 = (char)uVar27;
  auVar73._2_13_ = auVar98;
  auVar73._0_2_ = CONCAT11(cVar199,cVar151);
  uVar201 = (undefined2)Var88;
  auVar333._0_12_ = auVar73._0_12_;
  auVar333._12_2_ = uVar201;
  auVar333._14_2_ = uVar201;
  auVar332._12_4_ = auVar333._12_4_;
  auVar332._0_10_ = auVar73._0_10_;
  auVar332._10_2_ = auVar68._4_2_;
  auVar331._10_6_ = auVar332._10_6_;
  auVar331._0_8_ = auVar73._0_8_;
  auVar331._8_2_ = auVar68._4_2_;
  auVar99._4_8_ = auVar331._8_8_;
  auVar99._2_2_ = auVar98._0_2_;
  auVar99._0_2_ = auVar98._0_2_;
  iVar346 = (int)CONCAT11(cVar199,cVar151) >> 8;
  iVar347 = auVar99._0_4_ >> 0x18;
  auVar321._0_8_ = CONCAT44(iVar347,iVar346);
  auVar321._8_4_ = auVar331._8_4_ >> 0x18;
  auVar334._12_4_ = auVar332._12_4_ >> 0x18;
  auVar334._0_12_ = auVar321;
  fVar420 = (float)iVar347;
  cVar151 = cVar206 >> 7;
  auVar39[0xd] = 0;
  auVar39._0_13_ = auVar334._0_13_;
  auVar39[0xe] = cVar151;
  auVar44[0xc] = cVar151;
  auVar44._0_12_ = auVar321;
  auVar44._13_2_ = auVar39._13_2_;
  auVar49[0xb] = 0;
  auVar49._0_11_ = auVar321._0_11_;
  auVar49._12_3_ = auVar44._12_3_;
  auVar54[10] = cVar151;
  auVar54._0_10_ = auVar321._0_10_;
  auVar54._11_4_ = auVar49._11_4_;
  auVar59[9] = 0;
  auVar59._0_9_ = auVar321._0_9_;
  auVar59._10_5_ = auVar54._10_5_;
  auVar64[8] = cVar206;
  auVar64._0_8_ = auVar321._0_8_;
  auVar64._9_6_ = auVar59._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar64._8_7_,(char)((uint)uVar28 >> 0x18)),(short)cVar199 >> 7);
  auVar69._6_9_ = Var88;
  auVar69[5] = (char)((uint)uVar28 >> 0x10);
  auVar69[4] = (undefined1)((short)cVar199 >> 7);
  auVar69._0_4_ = iVar346;
  auVar100._2_11_ = auVar69._4_11_;
  auVar100[1] = (char)((uint)uVar28 >> 8);
  auVar100[0] = (undefined1)((short)cVar199 >> 7);
  sVar152 = CONCAT11((char)uVar28,cVar199);
  auVar74._2_13_ = auVar100;
  auVar74._0_2_ = sVar152;
  uVar201 = (undefined2)Var88;
  auVar337._0_12_ = auVar74._0_12_;
  auVar337._12_2_ = uVar201;
  auVar337._14_2_ = uVar201;
  auVar336._12_4_ = auVar337._12_4_;
  auVar336._0_10_ = auVar74._0_10_;
  auVar336._10_2_ = auVar69._4_2_;
  auVar335._10_6_ = auVar336._10_6_;
  auVar335._0_8_ = auVar74._0_8_;
  auVar335._8_2_ = auVar69._4_2_;
  auVar101._4_8_ = auVar335._8_8_;
  auVar101._2_2_ = auVar100._0_2_;
  auVar101._0_2_ = auVar100._0_2_;
  fVar209 = (float)((int)sVar152 >> 8);
  fVar248 = (float)(auVar101._0_4_ >> 0x18);
  fVar250 = (float)(auVar335._8_4_ >> 0x18);
  fVar316 = fVar424 * (float)iVar205 + fVar431 * (float)iVar153 + fVar435 * (float)iVar203;
  fVar348 = fVar424 * fVar279 + fVar431 * fVar366 + fVar435 * fVar398;
  fVar350 = fVar424 * (float)auVar319._8_4_ +
            fVar431 * (float)auVar154._8_4_ + fVar435 * (float)auVar155._8_4_;
  fVar352 = fVar424 * (float)auVar326._12_4_ +
            fVar431 * (float)auVar373._12_4_ + fVar435 * (float)auVar159._12_4_;
  fVar452 = fVar424 * fVar208 + fVar431 * (float)iVar204 + fVar315;
  fVar459 = fVar424 * fVar247 + fVar431 * fVar378 + fVar344;
  fVar462 = fVar424 * fVar249 + fVar431 * (float)auVar156._8_4_ + auVar318._8_4_;
  fVar465 = fVar424 * (float)(auVar212._12_4_ >> 0x18) +
            fVar431 * (float)auVar163._12_4_ + auVar322._12_4_;
  fVar315 = fVar424 * (float)iVar345 + fVar431 * (float)iVar346 + fVar435 * fVar209;
  fVar344 = fVar424 * fVar412 + fVar431 * fVar420 + fVar435 * fVar248;
  fVar207 = fVar424 * (float)auVar320._8_4_ + fVar431 * (float)auVar321._8_4_ + fVar435 * fVar250;
  fVar435 = fVar424 * (float)auVar330._12_4_ +
            fVar431 * (float)auVar334._12_4_ + fVar435 * (float)(auVar336._12_4_ >> 0x18);
  uVar210 = *(undefined8 *)(prim + uVar130 * 7 + 6);
  local_4f8._0_2_ = (short)uVar210;
  local_4f8._2_2_ = (short)((ulong)uVar210 >> 0x10);
  uStack_4f4._0_2_ = (undefined2)((ulong)uVar210 >> 0x20);
  uStack_4f4._2_2_ = (undefined2)((ulong)uVar210 >> 0x30);
  fStack_4f0 = 0.0;
  fStack_4ec = 0.0;
  uVar11 = *(undefined8 *)(prim + uVar130 * 0xb + 6);
  uVar12 = *(undefined8 *)(prim + uVar130 * 9 + 6);
  uVar13 = *(undefined8 *)(prim + uVar130 * 0xd + 6);
  local_588 = (short)uVar13;
  uStack_586 = (undefined2)((ulong)uVar13 >> 0x10);
  uStack_584 = (undefined2)((ulong)uVar13 >> 0x20);
  uStack_582 = (undefined2)((ulong)uVar13 >> 0x30);
  fVar425 = (float)iVar205 * fVar288 + (float)iVar153 * fVar313 + (float)iVar203 * fVar314;
  fVar432 = fVar279 * fVar288 + fVar366 * fVar313 + fVar398 * fVar314;
  fVar436 = (float)auVar319._8_4_ * fVar288 +
            (float)auVar154._8_4_ * fVar313 + (float)auVar155._8_4_ * fVar314;
  fVar439 = (float)auVar326._12_4_ * fVar288 +
            (float)auVar373._12_4_ * fVar313 + (float)auVar159._12_4_ * fVar314;
  fVar431 = fVar208 * fVar288 + (float)iVar204 * fVar313 + fVar442 * fVar314;
  fVar442 = fVar247 * fVar288 + fVar378 * fVar313 + fVar447 * fVar314;
  fVar447 = fVar249 * fVar288 + (float)auVar156._8_4_ * fVar313 + fVar449 * fVar314;
  fVar449 = (float)(auVar212._12_4_ >> 0x18) * fVar288 +
            (float)auVar163._12_4_ * fVar313 + (float)(auVar165._12_4_ >> 0x18) * fVar314;
  fVar398 = fVar288 * (float)iVar345 + fVar313 * (float)iVar346 + fVar314 * fVar209;
  fVar412 = fVar288 * fVar412 + fVar313 * fVar420 + fVar314 * fVar248;
  fVar420 = fVar288 * (float)auVar320._8_4_ + fVar313 * (float)auVar321._8_4_ + fVar314 * fVar250;
  fVar424 = fVar288 * (float)auVar330._12_4_ +
            fVar313 * (float)auVar334._12_4_ + fVar314 * (float)(auVar336._12_4_ >> 0x18);
  uVar143 = -(uint)(1e-18 <= ABS(fVar316));
  uVar145 = -(uint)(1e-18 <= ABS(fVar348));
  uVar147 = -(uint)(1e-18 <= ABS(fVar350));
  uVar149 = -(uint)(1e-18 <= ABS(fVar352));
  auVar338._0_4_ = (uint)fVar316 & uVar143;
  auVar338._4_4_ = (uint)fVar348 & uVar145;
  auVar338._8_4_ = (uint)fVar350 & uVar147;
  auVar338._12_4_ = (uint)fVar352 & uVar149;
  auVar214._0_8_ = CONCAT44(~uVar145,~uVar143) & 0x219392ef219392ef;
  auVar214._8_4_ = ~uVar147 & 0x219392ef;
  auVar214._12_4_ = ~uVar149 & 0x219392ef;
  auVar214 = auVar214 | auVar338;
  uVar143 = -(uint)(1e-18 <= ABS(fVar452));
  uVar145 = -(uint)(1e-18 <= ABS(fVar459));
  uVar147 = -(uint)(1e-18 <= ABS(fVar462));
  uVar149 = -(uint)(1e-18 <= ABS(fVar465));
  auVar455._0_4_ = (uint)fVar452 & uVar143;
  auVar455._4_4_ = (uint)fVar459 & uVar145;
  auVar455._8_4_ = (uint)fVar462 & uVar147;
  auVar455._12_4_ = (uint)fVar465 & uVar149;
  auVar291._0_8_ = CONCAT44(~uVar145,~uVar143) & 0x219392ef219392ef;
  auVar291._8_4_ = ~uVar147 & 0x219392ef;
  auVar291._12_4_ = ~uVar149 & 0x219392ef;
  auVar291 = auVar291 | auVar455;
  uVar143 = -(uint)(1e-18 <= ABS(fVar315));
  uVar145 = -(uint)(1e-18 <= ABS(fVar344));
  uVar147 = -(uint)(1e-18 <= ABS(fVar207));
  uVar149 = -(uint)(1e-18 <= ABS(fVar435));
  auVar167._0_4_ = (uint)fVar315 & uVar143;
  auVar167._4_4_ = (uint)fVar344 & uVar145;
  auVar167._8_4_ = (uint)fVar207 & uVar147;
  auVar167._12_4_ = (uint)fVar435 & uVar149;
  auVar417._0_8_ = CONCAT44(~uVar145,~uVar143) & 0x219392ef219392ef;
  auVar417._8_4_ = ~uVar147 & 0x219392ef;
  auVar417._12_4_ = ~uVar149 & 0x219392ef;
  auVar417 = auVar417 | auVar167;
  auVar168 = rcpps(auVar167,auVar214);
  fVar435 = auVar168._0_4_;
  fVar207 = auVar168._4_4_;
  fVar250 = auVar168._8_4_;
  fVar348 = auVar168._12_4_;
  fVar435 = (1.0 - auVar214._0_4_ * fVar435) * fVar435 + fVar435;
  fVar207 = (1.0 - auVar214._4_4_ * fVar207) * fVar207 + fVar207;
  fVar250 = (1.0 - auVar214._8_4_ * fVar250) * fVar250 + fVar250;
  fVar348 = (1.0 - auVar214._12_4_ * fVar348) * fVar348 + fVar348;
  auVar168 = rcpps(auVar168,auVar291);
  fVar315 = auVar168._0_4_;
  auVar292._0_4_ = auVar291._0_4_ * fVar315;
  fVar208 = auVar168._4_4_;
  fVar247 = auVar291._4_4_ * fVar208;
  auVar289._0_8_ = CONCAT44(fVar247,auVar292._0_4_);
  fVar279 = auVar168._8_4_;
  auVar289._8_4_ = auVar291._8_4_ * fVar279;
  fVar350 = auVar168._12_4_;
  fVar315 = (1.0 - auVar292._0_4_) * fVar315 + fVar315;
  fVar208 = (1.0 - fVar247) * fVar208 + fVar208;
  fVar279 = (1.0 - auVar289._8_4_) * fVar279 + fVar279;
  fVar350 = (1.0 - auVar291._12_4_ * fVar350) * fVar350 + fVar350;
  auVar168 = rcpps(auVar168,auVar417);
  fVar344 = auVar168._0_4_;
  fVar209 = auVar168._4_4_;
  fVar288 = auVar168._8_4_;
  fVar352 = auVar168._12_4_;
  uVar133 = *(ulong *)(prim + uVar130 * 0x12 + 6);
  fVar344 = (1.0 - auVar417._0_4_ * fVar344) * fVar344 + fVar344;
  fVar209 = (1.0 - auVar417._4_4_ * fVar209) * fVar209 + fVar209;
  fVar288 = (1.0 - auVar417._8_4_ * fVar288) * fVar288 + fVar288;
  fVar352 = (1.0 - auVar417._12_4_ * fVar352) * fVar352 + fVar352;
  uVar14 = *(ulong *)(prim + uVar130 * 0x16 + 6);
  auVar295._12_2_ = (short)((uint)fVar247 >> 0x10);
  auVar295._0_12_ = auVar289;
  auVar295._14_2_ = uStack_4f4._2_2_;
  auVar294._12_4_ = auVar295._12_4_;
  auVar294._0_10_ = auVar289._0_10_;
  auVar294._10_2_ = (undefined2)uStack_4f4;
  auVar293._10_6_ = auVar294._10_6_;
  auVar293._8_2_ = SUB42(fVar247,0);
  auVar293._0_8_ = auVar289._0_8_;
  auVar292._8_8_ = auVar293._8_8_;
  auVar292._6_2_ = local_4f8._2_2_;
  auVar292._4_2_ = (short)((uint)auVar292._0_4_ >> 0x10);
  auVar296._0_4_ = (int)(short)local_4f8;
  iVar153 = auVar292._4_4_ >> 0x10;
  auVar290._0_8_ = CONCAT44(iVar153,auVar296._0_4_);
  auVar290._8_4_ = auVar293._8_4_ >> 0x10;
  auVar382._0_4_ = (float)auVar296._0_4_;
  fVar452 = (float)iVar153;
  auVar380._0_8_ = CONCAT44(fVar452,auVar382._0_4_);
  auVar380._8_4_ = (float)auVar290._8_4_;
  auVar299._12_2_ = local_4f8._2_2_ >> 0xf;
  auVar299._0_12_ = auVar290;
  auVar299._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar298._12_4_ = auVar299._12_4_;
  auVar298._0_10_ = auVar290._0_10_;
  auVar298._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar297._10_6_ = auVar298._10_6_;
  auVar297._8_2_ = local_4f8._2_2_;
  auVar297._0_8_ = auVar290._0_8_;
  auVar296._8_8_ = auVar297._8_8_;
  auVar296._6_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar296._4_2_ = (short)local_4f8 >> 0xf;
  auVar385._12_2_ = (short)((uint)fVar452 >> 0x10);
  auVar385._0_12_ = auVar380;
  auVar385._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar384._12_4_ = auVar385._12_4_;
  auVar384._0_10_ = auVar380._0_10_;
  auVar384._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar383._10_6_ = auVar384._10_6_;
  auVar383._8_2_ = SUB42(fVar452,0);
  auVar383._0_8_ = auVar380._0_8_;
  auVar382._8_8_ = auVar383._8_8_;
  sVar152 = (short)((ulong)uVar12 >> 0x10);
  auVar382._6_2_ = sVar152;
  auVar382._4_2_ = (short)((uint)auVar382._0_4_ >> 0x10);
  auVar386._0_4_ = (int)(short)uVar12;
  iVar153 = auVar382._4_4_ >> 0x10;
  auVar381._0_8_ = CONCAT44(iVar153,auVar386._0_4_);
  auVar381._8_4_ = auVar383._8_4_ >> 0x10;
  fVar459 = (float)iVar153;
  auVar389._12_2_ = sVar152 >> 0xf;
  auVar389._0_12_ = auVar381;
  auVar389._14_2_ = uStack_582;
  auVar388._12_4_ = auVar389._12_4_;
  auVar388._0_10_ = auVar381._0_10_;
  auVar388._10_2_ = uStack_584;
  auVar387._10_6_ = auVar388._10_6_;
  auVar387._8_2_ = sVar152;
  auVar387._0_8_ = auVar381._0_8_;
  auVar386._8_8_ = auVar387._8_8_;
  auVar386._6_2_ = uStack_586;
  auVar386._4_2_ = (short)uVar12 >> 0xf;
  uVar201 = (undefined2)(uVar133 >> 0x30);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar133;
  auVar217._12_2_ = uVar201;
  auVar217._14_2_ = uVar201;
  uVar201 = (undefined2)(uVar133 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar133;
  auVar216._10_2_ = uVar201;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar201;
  auVar215._0_8_ = uVar133;
  uVar201 = (undefined2)(uVar133 >> 0x10);
  auVar102._4_8_ = auVar215._8_8_;
  auVar102._2_2_ = uVar201;
  auVar102._0_2_ = uVar201;
  fVar366 = (float)(auVar102._0_4_ >> 0x10);
  fVar378 = (float)(auVar215._8_4_ >> 0x10);
  uVar201 = (undefined2)(uVar14 >> 0x30);
  auVar171._8_4_ = 0;
  auVar171._0_8_ = uVar14;
  auVar171._12_2_ = uVar201;
  auVar171._14_2_ = uVar201;
  uVar201 = (undefined2)(uVar14 >> 0x20);
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._8_2_ = 0;
  auVar170._0_8_ = uVar14;
  auVar170._10_2_ = uVar201;
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._8_2_ = uVar201;
  auVar169._0_8_ = uVar14;
  uVar201 = (undefined2)(uVar14 >> 0x10);
  auVar103._4_8_ = auVar169._8_8_;
  auVar103._2_2_ = uVar201;
  auVar103._0_2_ = uVar201;
  uVar15 = *(ulong *)(prim + uVar130 * 0x14 + 6);
  uVar201 = (undefined2)(uVar15 >> 0x30);
  auVar174._8_4_ = 0;
  auVar174._0_8_ = uVar15;
  auVar174._12_2_ = uVar201;
  auVar174._14_2_ = uVar201;
  uVar201 = (undefined2)(uVar15 >> 0x20);
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._8_2_ = 0;
  auVar173._0_8_ = uVar15;
  auVar173._10_2_ = uVar201;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._8_2_ = uVar201;
  auVar172._0_8_ = uVar15;
  uVar201 = (undefined2)(uVar15 >> 0x10);
  auVar104._4_8_ = auVar172._8_8_;
  auVar104._2_2_ = uVar201;
  auVar104._0_2_ = uVar201;
  fVar247 = (float)(auVar104._0_4_ >> 0x10);
  fVar313 = (float)(auVar172._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar130 * 0x18 + 6);
  uVar201 = (undefined2)(uVar16 >> 0x30);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar16;
  auVar220._12_2_ = uVar201;
  auVar220._14_2_ = uVar201;
  uVar201 = (undefined2)(uVar16 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar16;
  auVar219._10_2_ = uVar201;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar201;
  auVar218._0_8_ = uVar16;
  uVar201 = (undefined2)(uVar16 >> 0x10);
  auVar105._4_8_ = auVar218._8_8_;
  auVar105._2_2_ = uVar201;
  auVar105._0_2_ = uVar201;
  uVar17 = *(ulong *)(prim + uVar130 * 0x1d + 6);
  uVar201 = (undefined2)(uVar17 >> 0x30);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar17;
  auVar177._12_2_ = uVar201;
  auVar177._14_2_ = uVar201;
  uVar201 = (undefined2)(uVar17 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar17;
  auVar176._10_2_ = uVar201;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar201;
  auVar175._0_8_ = uVar17;
  uVar201 = (undefined2)(uVar17 >> 0x10);
  auVar106._4_8_ = auVar175._8_8_;
  auVar106._2_2_ = uVar201;
  auVar106._0_2_ = uVar201;
  fVar248 = (float)(auVar106._0_4_ >> 0x10);
  fVar314 = (float)(auVar175._8_4_ >> 0x10);
  uVar18 = *(ulong *)(prim + uVar130 * 0x21 + 6);
  uVar201 = (undefined2)(uVar18 >> 0x30);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar18;
  auVar223._12_2_ = uVar201;
  auVar223._14_2_ = uVar201;
  uVar201 = (undefined2)(uVar18 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar18;
  auVar222._10_2_ = uVar201;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar201;
  auVar221._0_8_ = uVar18;
  uVar201 = (undefined2)(uVar18 >> 0x10);
  auVar107._4_8_ = auVar221._8_8_;
  auVar107._2_2_ = uVar201;
  auVar107._0_2_ = uVar201;
  uVar19 = *(ulong *)(prim + uVar130 * 0x1f + 6);
  uVar201 = (undefined2)(uVar19 >> 0x30);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar19;
  auVar180._12_2_ = uVar201;
  auVar180._14_2_ = uVar201;
  uVar201 = (undefined2)(uVar19 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar19;
  auVar179._10_2_ = uVar201;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar201;
  auVar178._0_8_ = uVar19;
  uVar201 = (undefined2)(uVar19 >> 0x10);
  auVar108._4_8_ = auVar178._8_8_;
  auVar108._2_2_ = uVar201;
  auVar108._0_2_ = uVar201;
  fVar249 = (float)(auVar108._0_4_ >> 0x10);
  fVar316 = (float)(auVar178._8_4_ >> 0x10);
  uVar130 = *(ulong *)(prim + uVar130 * 0x23 + 6);
  uVar201 = (undefined2)(uVar130 >> 0x30);
  auVar226._8_4_ = 0;
  auVar226._0_8_ = uVar130;
  auVar226._12_2_ = uVar201;
  auVar226._14_2_ = uVar201;
  uVar201 = (undefined2)(uVar130 >> 0x20);
  auVar225._12_4_ = auVar226._12_4_;
  auVar225._8_2_ = 0;
  auVar225._0_8_ = uVar130;
  auVar225._10_2_ = uVar201;
  auVar224._10_6_ = auVar225._10_6_;
  auVar224._8_2_ = uVar201;
  auVar224._0_8_ = uVar130;
  uVar201 = (undefined2)(uVar130 >> 0x10);
  auVar109._4_8_ = auVar224._8_8_;
  auVar109._2_2_ = uVar201;
  auVar109._0_2_ = uVar201;
  auVar300._0_8_ =
       CONCAT44(((((float)(auVar296._4_4_ >> 0x10) - fVar452) * fVar468 + fVar452) - fVar432) *
                fVar207,((((float)(int)(short)uVar11 - auVar382._0_4_) * fVar468 + auVar382._0_4_) -
                        fVar425) * fVar435);
  auVar300._8_4_ =
       ((((float)(auVar297._8_4_ >> 0x10) - auVar380._8_4_) * fVar468 + auVar380._8_4_) - fVar436) *
       fVar250;
  auVar300._12_4_ =
       ((((float)(auVar298._12_4_ >> 0x10) - (float)(auVar294._12_4_ >> 0x10)) * fVar468 +
        (float)(auVar294._12_4_ >> 0x10)) - fVar439) * fVar348;
  auVar390._0_4_ =
       ((((float)(int)local_588 - (float)auVar386._0_4_) * fVar468 + (float)auVar386._0_4_) -
       fVar425) * fVar435;
  auVar390._4_4_ =
       ((((float)(auVar386._4_4_ >> 0x10) - fVar459) * fVar468 + fVar459) - fVar432) * fVar207;
  auVar390._8_4_ =
       ((((float)(auVar387._8_4_ >> 0x10) - (float)auVar381._8_4_) * fVar468 + (float)auVar381._8_4_
        ) - fVar436) * fVar250;
  auVar390._12_4_ =
       ((((float)(auVar388._12_4_ >> 0x10) - (float)(auVar384._12_4_ >> 0x10)) * fVar468 +
        (float)(auVar384._12_4_ >> 0x10)) - fVar439) * fVar348;
  auVar408._0_8_ =
       CONCAT44(((((float)(auVar103._0_4_ >> 0x10) - fVar366) * fVar468 + fVar366) - fVar442) *
                fVar208,((((float)(int)(short)uVar14 - (float)(int)(short)uVar133) * fVar468 +
                         (float)(int)(short)uVar133) - fVar431) * fVar315);
  auVar408._8_4_ =
       ((((float)(auVar169._8_4_ >> 0x10) - fVar378) * fVar468 + fVar378) - fVar447) * fVar279;
  auVar408._12_4_ =
       ((((float)(auVar170._12_4_ >> 0x10) - (float)(auVar216._12_4_ >> 0x10)) * fVar468 +
        (float)(auVar216._12_4_ >> 0x10)) - fVar449) * fVar350;
  auVar418._0_4_ =
       ((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar468 +
        (float)(int)(short)uVar15) - fVar431) * fVar315;
  auVar418._4_4_ =
       ((((float)(auVar105._0_4_ >> 0x10) - fVar247) * fVar468 + fVar247) - fVar442) * fVar208;
  auVar418._8_4_ =
       ((((float)(auVar218._8_4_ >> 0x10) - fVar313) * fVar468 + fVar313) - fVar447) * fVar279;
  auVar418._12_4_ =
       ((((float)(auVar219._12_4_ >> 0x10) - (float)(auVar173._12_4_ >> 0x10)) * fVar468 +
        (float)(auVar173._12_4_ >> 0x10)) - fVar449) * fVar350;
  auVar428._0_8_ =
       CONCAT44(((((float)(auVar107._0_4_ >> 0x10) - fVar248) * fVar468 + fVar248) - fVar412) *
                fVar209,((((float)(int)(short)uVar18 - (float)(int)(short)uVar17) * fVar468 +
                         (float)(int)(short)uVar17) - fVar398) * fVar344);
  auVar428._8_4_ =
       ((((float)(auVar221._8_4_ >> 0x10) - fVar314) * fVar468 + fVar314) - fVar420) * fVar288;
  auVar428._12_4_ =
       ((((float)(auVar222._12_4_ >> 0x10) - (float)(auVar176._12_4_ >> 0x10)) * fVar468 +
        (float)(auVar176._12_4_ >> 0x10)) - fVar424) * fVar352;
  auVar444._0_4_ =
       ((((float)(int)(short)uVar130 - (float)(int)(short)uVar19) * fVar468 +
        (float)(int)(short)uVar19) - fVar398) * fVar344;
  auVar444._4_4_ =
       ((((float)(auVar109._0_4_ >> 0x10) - fVar249) * fVar468 + fVar249) - fVar412) * fVar209;
  auVar444._8_4_ =
       ((((float)(auVar224._8_4_ >> 0x10) - fVar316) * fVar468 + fVar316) - fVar420) * fVar288;
  auVar444._12_4_ =
       ((((float)(auVar225._12_4_ >> 0x10) - (float)(auVar179._12_4_ >> 0x10)) * fVar468 +
        (float)(auVar179._12_4_ >> 0x10)) - fVar424) * fVar352;
  auVar261._8_4_ = auVar300._8_4_;
  auVar261._0_8_ = auVar300._0_8_;
  auVar261._12_4_ = auVar300._12_4_;
  auVar262 = minps(auVar261,auVar390);
  auVar227._8_4_ = auVar408._8_4_;
  auVar227._0_8_ = auVar408._0_8_;
  auVar227._12_4_ = auVar408._12_4_;
  auVar168 = minps(auVar227,auVar418);
  auVar262 = maxps(auVar262,auVar168);
  auVar228._8_4_ = auVar428._8_4_;
  auVar228._0_8_ = auVar428._0_8_;
  auVar228._12_4_ = auVar428._12_4_;
  auVar168 = minps(auVar228,auVar444);
  uVar134 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar252._4_4_ = uVar134;
  auVar252._0_4_ = uVar134;
  auVar252._8_4_ = uVar134;
  auVar252._12_4_ = uVar134;
  auVar168 = maxps(auVar168,auVar252);
  auVar168 = maxps(auVar262,auVar168);
  fVar315 = auVar168._0_4_ * 0.99999964;
  fVar344 = auVar168._4_4_ * 0.99999964;
  fVar207 = auVar168._8_4_ * 0.99999964;
  fVar208 = auVar168._12_4_ * 0.99999964;
  auVar168 = maxps(auVar300,auVar390);
  auVar262 = maxps(auVar408,auVar418);
  auVar168 = minps(auVar168,auVar262);
  auVar262 = maxps(auVar428,auVar444);
  fVar435 = (ray->super_RayK<1>).tfar;
  auVar229._4_4_ = fVar435;
  auVar229._0_4_ = fVar435;
  auVar229._8_4_ = fVar435;
  auVar229._12_4_ = fVar435;
  auVar262 = minps(auVar262,auVar229);
  auVar168 = minps(auVar168,auVar262);
  auVar230._0_4_ = -(uint)(PVar21 != (Primitive)0x0 && fVar315 <= auVar168._0_4_ * 1.0000004);
  auVar230._4_4_ = -(uint)(1 < (byte)PVar21 && fVar344 <= auVar168._4_4_ * 1.0000004);
  auVar230._8_4_ = -(uint)(2 < (byte)PVar21 && fVar207 <= auVar168._8_4_ * 1.0000004);
  auVar230._12_4_ = -(uint)(3 < (byte)PVar21 && fVar208 <= auVar168._12_4_ * 1.0000004);
  uVar134 = movmskps((int)prim,auVar230);
  local_340 = CONCAT44((int)((ulong)prim >> 0x20),uVar134);
  auVar231._0_12_ = mm_lookupmask_ps._240_12_;
  auVar231._12_4_ = 0;
  local_348 = prim;
  local_4f8 = (float)uVar210;
  uStack_4f4 = (float)((ulong)uVar210 >> 0x20);
LAB_0037549a:
  if (local_340 == 0) {
    return;
  }
  lVar140 = 0;
  if (local_340 != 0) {
    for (; (local_340 >> lVar140 & 1) == 0; lVar140 = lVar140 + 1) {
    }
  }
  uVar143 = *(uint *)(local_348 + 2);
  uVar145 = *(uint *)(local_348 + lVar140 * 4 + 6);
  pGVar29 = (context->scene->geometries).items[uVar143].ptr;
  uVar133 = (ulong)*(uint *)(*(long *)&pGVar29->field_0x58 +
                            (ulong)uVar145 *
                            pGVar29[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar435 = pGVar29->fnumTimeSegments;
  fVar209 = (pGVar29->time_range).lower;
  fVar247 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar209) /
            ((pGVar29->time_range).upper - fVar209)) * fVar435;
  fVar209 = floorf(fVar247);
  fVar435 = fVar435 + -1.0;
  if (fVar435 <= fVar209) {
    fVar209 = fVar435;
  }
  fVar435 = 0.0;
  if (0.0 <= fVar209) {
    fVar435 = fVar209;
  }
  fVar247 = fVar247 - fVar435;
  fVar314 = 1.0 - fVar247;
  _Var30 = pGVar29[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar141 = (long)(int)fVar435 * 0x38;
  lVar140 = *(long *)(_Var30 + lVar141);
  lVar31 = *(long *)(_Var30 + 0x10 + lVar141);
  pRVar135 = (RTCIntersectArguments *)(lVar31 * (uVar133 + 3));
  pRVar137 = *(RTCIntersectArguments **)(_Var30 + 0x38 + lVar141);
  lVar141 = *(long *)(_Var30 + 0x48 + lVar141);
  pRVar1 = (RTCRayQueryFlags *)((long)&pRVar137->flags + uVar133 * lVar141);
  pfVar2 = (float *)(lVar140 + lVar31 * uVar133);
  fVar316 = *pfVar2 * fVar314 + (float)*pRVar1 * fVar247;
  fVar348 = pfVar2[1] * fVar314 + (float)pRVar1[1] * fVar247;
  fVar350 = pfVar2[2] * fVar314 + (float)pRVar1[2] * fVar247;
  pRVar3 = (RTCRayQueryFlags *)((long)&pRVar137->flags + (uVar133 + 1) * lVar141);
  pfVar4 = (float *)(lVar140 + lVar31 * (uVar133 + 1));
  local_4f8 = *pfVar4 * fVar314 + (float)*pRVar3 * fVar247;
  fVar352 = pfVar4[1] * fVar314 + (float)pRVar3[1] * fVar247;
  fStack_4f0 = pfVar4[2] * fVar314 + (float)pRVar3[2] * fVar247;
  pRVar5 = (RTCRayQueryFlags *)((long)&pRVar137->flags + (uVar133 + 2) * lVar141);
  pfVar6 = (float *)(lVar140 + lVar31 * (uVar133 + 2));
  fVar378 = *pfVar6 * fVar314 + (float)*pRVar5 * fVar247;
  fVar398 = pfVar6[1] * fVar314 + (float)pRVar5[1] * fVar247;
  fVar412 = pfVar6[2] * fVar314 + (float)pRVar5[2] * fVar247;
  pRVar7 = (RTCRayQueryFlags *)((long)&pRVar137->flags + lVar141 * (uVar133 + 3));
  pfVar8 = (float *)((long)&pRVar135->flags + lVar140);
  local_5f8._0_4_ = fVar314 * *pfVar8 + fVar247 * (float)*pRVar7;
  local_5f8._4_4_ = fVar314 * pfVar8[1] + fVar247 * (float)pRVar7[1];
  fStack_5f0 = fVar314 * pfVar8[2] + fVar247 * (float)pRVar7[2];
  fVar435 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar209 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar248 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar249 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar250 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar279 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar288 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar424 = fVar249 * fVar249;
  fVar431 = fVar250 * fVar250;
  fVar442 = fVar279 * fVar279;
  fVar288 = fVar288 * fVar288;
  fVar313 = fVar424 + fVar431 + fVar442;
  auVar301._0_8_ = CONCAT44(fVar431 + fVar431 + fVar288,fVar313);
  auVar301._8_4_ = fVar442 + fVar431 + fVar442;
  auVar301._12_4_ = fVar288 + fVar431 + fVar288;
  auVar263._8_4_ = auVar301._8_4_;
  auVar263._0_8_ = auVar301._0_8_;
  auVar263._12_4_ = auVar301._12_4_;
  auVar168 = rcpss(auVar263,auVar301);
  fVar288 = (2.0 - fVar313 * auVar168._0_4_) * auVar168._0_4_ *
            (((fVar350 + fStack_4f0 + fVar412 + fStack_5f0) * 0.25 - fVar248) * fVar279 +
            ((fVar348 + fVar352 + fVar398 + (float)local_5f8._4_4_) * 0.25 - fVar209) * fVar250 +
            ((fVar316 + local_4f8 + fVar378 + (float)local_5f8._0_4_) * 0.25 - fVar435) * fVar249);
  local_358 = ZEXT416((uint)fVar288);
  fVar435 = fVar249 * fVar288 + fVar435;
  fVar209 = fVar250 * fVar288 + fVar209;
  fVar248 = fVar279 * fVar288 + fVar248;
  fVar316 = fVar316 - fVar435;
  fVar348 = fVar348 - fVar209;
  fVar350 = fVar350 - fVar248;
  fVar313 = (pfVar2[3] * fVar314 + (float)pRVar1[3] * fVar247) - 0.0;
  fVar378 = fVar378 - fVar435;
  fVar398 = fVar398 - fVar209;
  fVar412 = fVar412 - fVar248;
  fVar420 = (pfVar6[3] * fVar314 + (float)pRVar5[3] * fVar247) - 0.0;
  local_4f8 = local_4f8 - fVar435;
  fVar352 = fVar352 - fVar209;
  fStack_4f0 = fStack_4f0 - fVar248;
  fVar366 = (pfVar4[3] * fVar314 + (float)pRVar3[3] * fVar247) - 0.0;
  local_5f8._0_4_ = (float)local_5f8._0_4_ - fVar435;
  local_5f8._4_4_ = (float)local_5f8._4_4_ - fVar209;
  fStack_5f0 = fStack_5f0 - fVar248;
  fStack_5ec = (fVar314 * pfVar8[3] + fVar247 * (float)pRVar7[3]) - 0.0;
  local_278 = fVar316;
  fStack_274 = fVar316;
  fStack_270 = fVar316;
  fStack_26c = fVar316;
  local_288 = fVar348;
  fStack_284 = fVar348;
  fStack_280 = fVar348;
  fStack_27c = fVar348;
  local_298 = fVar313;
  fStack_294 = fVar313;
  fStack_290 = fVar313;
  fStack_28c = fVar313;
  local_2a8 = local_4f8;
  fStack_2a4 = local_4f8;
  fStack_2a0 = local_4f8;
  fStack_29c = local_4f8;
  local_2b8 = fStack_4f0;
  fStack_2b4 = fStack_4f0;
  fStack_2b0 = fStack_4f0;
  fStack_2ac = fStack_4f0;
  fVar247 = fVar424 + fVar442 + fVar431;
  fVar248 = fVar424 + fVar442 + fVar431;
  fVar314 = fVar424 + fVar442 + fVar431;
  fVar424 = fVar424 + fVar442 + fVar431;
  local_2c8 = fVar378;
  fStack_2c4 = fVar378;
  fStack_2c0 = fVar378;
  fStack_2bc = fVar378;
  local_2d8 = fVar398;
  fStack_2d4 = fVar398;
  fStack_2d0 = fVar398;
  fStack_2cc = fVar398;
  local_2e8 = fVar412;
  fStack_2e4 = fVar412;
  fStack_2e0 = fVar412;
  fStack_2dc = fVar412;
  local_2f8 = fVar420;
  fStack_2f4 = fVar420;
  fStack_2f0 = fVar420;
  fStack_2ec = fVar420;
  local_308 = (float)local_5f8._4_4_;
  fStack_304 = (float)local_5f8._4_4_;
  fStack_300 = (float)local_5f8._4_4_;
  fStack_2fc = (float)local_5f8._4_4_;
  local_318 = fStack_5f0;
  fStack_314 = fStack_5f0;
  fStack_310 = fStack_5f0;
  fStack_30c = fStack_5f0;
  local_328 = fStack_5ec;
  fStack_324 = fStack_5ec;
  fStack_320 = fStack_5ec;
  fStack_31c = fStack_5ec;
  local_338 = ABS(fVar247);
  fStack_334 = ABS(fVar248);
  fStack_330 = ABS(fVar314);
  fStack_32c = ABS(fVar424);
  pSVar131 = (StackEntry *)0x1;
  local_60c = 1.4013e-45;
  fVar435 = 0.0;
  fVar209 = 1.0;
  pRVar138 = (RTCIntersectArguments *)0x0;
  fStack_4ec = fVar366;
  uStack_4f4 = fVar352;
  do {
    uStack_582 = (undefined2)((uint)fVar348 >> 0x10);
    uStack_584 = SUB42(fVar348,0);
    fVar354 = fVar209 - fVar435;
    fVar452 = fVar354 * 0.11111111;
    fVar355 = fVar354 * 0.0 + fVar435;
    fVar367 = fVar354 * 0.33333334 + fVar435;
    fVar368 = fVar354 * 0.6666667 + fVar435;
    fVar370 = fVar354 * 1.0 + fVar435;
    fVar317 = 1.0 - fVar355;
    fVar349 = 1.0 - fVar367;
    fVar351 = 1.0 - fVar368;
    fVar353 = 1.0 - fVar370;
    fVar431 = fVar355 * fVar317;
    fVar442 = fVar367 * fVar349;
    fVar447 = fVar368 * fVar351;
    fVar449 = fVar370 * fVar353;
    fVar459 = fVar317 * fVar317 * fVar317;
    fVar432 = fVar349 * fVar349 * fVar349;
    fVar439 = fVar351 * fVar351 * fVar351;
    fVar462 = fVar353 * fVar353 * fVar353;
    fVar407 = fVar355 * fVar355 * fVar355;
    fVar413 = fVar367 * fVar367 * fVar367;
    fVar414 = fVar368 * fVar368 * fVar368;
    fVar415 = fVar370 * fVar370 * fVar370;
    fVar425 = fVar459 * 0.16666667;
    fVar436 = fVar432 * 0.16666667;
    fVar465 = fVar439 * 0.16666667;
    fVar468 = fVar462 * 0.16666667;
    fVar379 = (fVar355 * fVar431 * 6.0 + fVar317 * fVar431 * 12.0 + fVar459 * 4.0 + fVar407) *
              0.16666667;
    fVar399 = (fVar367 * fVar442 * 6.0 + fVar349 * fVar442 * 12.0 + fVar432 * 4.0 + fVar413) *
              0.16666667;
    fVar401 = (fVar368 * fVar447 * 6.0 + fVar351 * fVar447 * 12.0 + fVar439 * 4.0 + fVar414) *
              0.16666667;
    fVar404 = (fVar370 * fVar449 * 6.0 + fVar353 * fVar449 * 12.0 + fVar462 * 4.0 + fVar415) *
              0.16666667;
    fVar459 = (fVar317 * fVar431 * 6.0 + fVar355 * fVar431 * 12.0 + fVar407 * 4.0 + fVar459) *
              0.16666667;
    fVar432 = (fVar349 * fVar442 * 6.0 + fVar367 * fVar442 * 12.0 + fVar413 * 4.0 + fVar432) *
              0.16666667;
    fVar282 = (fVar351 * fVar447 * 6.0 + fVar368 * fVar447 * 12.0 + fVar414 * 4.0 + fVar439) *
              0.16666667;
    fVar285 = (fVar353 * fVar449 * 6.0 + fVar370 * fVar449 * 12.0 + fVar415 * 4.0 + fVar462) *
              0.16666667;
    fVar407 = fVar407 * 0.16666667;
    fVar413 = fVar413 * 0.16666667;
    fVar414 = fVar414 * 0.16666667;
    fVar415 = fVar415 * 0.16666667;
    local_508 = local_278 * fVar425 +
                local_2a8 * fVar379 + local_2c8 * fVar459 + (float)local_5f8._0_4_ * fVar407;
    fStack_504 = fStack_274 * fVar436 +
                 fStack_2a4 * fVar399 + fStack_2c4 * fVar432 + (float)local_5f8._0_4_ * fVar413;
    fStack_500 = fStack_270 * fVar465 +
                 fStack_2a0 * fVar401 + fStack_2c0 * fVar282 + (float)local_5f8._0_4_ * fVar414;
    fStack_4fc = fStack_26c * fVar468 +
                 fStack_29c * fVar404 + fStack_2bc * fVar285 + (float)local_5f8._0_4_ * fVar415;
    fVar473 = local_288 * fVar425 + fVar352 * fVar379 + local_2d8 * fVar459 + local_308 * fVar407;
    fVar478 = fStack_284 * fVar436 + fVar352 * fVar399 + fStack_2d4 * fVar432 + fStack_304 * fVar413
    ;
    fVar479 = fStack_280 * fVar465 + fVar352 * fVar401 + fStack_2d0 * fVar282 + fStack_300 * fVar414
    ;
    fVar480 = fStack_27c * fVar468 + fVar352 * fVar404 + fStack_2cc * fVar285 + fStack_2fc * fVar415
    ;
    fVar259 = fVar350 * fVar425 + local_2b8 * fVar379 + local_2e8 * fVar459 + local_318 * fVar407;
    fVar280 = fVar350 * fVar436 + fStack_2b4 * fVar399 + fStack_2e4 * fVar432 + fStack_314 * fVar413
    ;
    fVar283 = fVar350 * fVar465 + fStack_2b0 * fVar401 + fStack_2e0 * fVar282 + fStack_310 * fVar414
    ;
    fVar286 = fVar350 * fVar468 + fStack_2ac * fVar404 + fStack_2dc * fVar285 + fStack_30c * fVar415
    ;
    fVar439 = fVar425 * local_298 + fVar379 * fVar366 + fVar459 * local_2f8 + fVar407 * local_328;
    fVar462 = fVar436 * fStack_294 + fVar399 * fVar366 + fVar432 * fStack_2f4 + fVar413 * fStack_324
    ;
    auVar253._0_8_ = CONCAT44(fVar462,fVar439);
    auVar253._8_4_ =
         fVar465 * fStack_290 + fVar401 * fVar366 + fVar282 * fStack_2f0 + fVar414 * fStack_320;
    auVar253._12_4_ =
         fVar468 * fStack_28c + fVar404 * fVar366 + fVar285 * fStack_2ec + fVar415 * fStack_31c;
    fVar459 = -fVar317 * fVar317 * 0.5;
    fVar425 = -fVar349 * fVar349 * 0.5;
    fVar432 = -fVar351 * fVar351 * 0.5;
    fVar436 = -fVar353 * fVar353 * 0.5;
    fVar379 = (-fVar355 * fVar355 - fVar431 * 4.0) * 0.5;
    fVar465 = (-fVar367 * fVar367 - fVar442 * 4.0) * 0.5;
    fVar468 = (-fVar368 * fVar368 - fVar447 * 4.0) * 0.5;
    fVar282 = (-fVar370 * fVar370 - fVar449 * 4.0) * 0.5;
    fVar431 = (fVar431 * 4.0 + fVar317 * fVar317) * 0.5;
    fVar442 = (fVar442 * 4.0 + fVar349 * fVar349) * 0.5;
    fVar447 = (fVar447 * 4.0 + fVar351 * fVar351) * 0.5;
    fVar449 = (fVar449 * 4.0 + fVar353 * fVar353) * 0.5;
    fVar404 = fVar355 * fVar355 * 0.5;
    fVar285 = fVar367 * fVar367 * 0.5;
    fVar317 = fVar368 * fVar368 * 0.5;
    fVar349 = fVar370 * fVar370 * 0.5;
    fVar416 = (local_278 * fVar459 +
              local_2a8 * fVar379 + local_2c8 * fVar431 + (float)local_5f8._0_4_ * fVar404) *
              fVar452;
    fVar421 = (fStack_274 * fVar425 +
              fStack_2a4 * fVar465 + fStack_2c4 * fVar442 + (float)local_5f8._0_4_ * fVar285) *
              fVar452;
    fVar422 = (fStack_270 * fVar432 +
              fStack_2a0 * fVar468 + fStack_2c0 * fVar447 + (float)local_5f8._0_4_ * fVar317) *
              fVar452;
    fVar423 = (fStack_26c * fVar436 +
              fStack_29c * fVar282 + fStack_2bc * fVar449 + (float)local_5f8._0_4_ * fVar349) *
              fVar452;
    fVar426 = (local_288 * fVar459 + fVar352 * fVar379 + local_2d8 * fVar431 + local_308 * fVar404)
              * fVar452;
    fVar433 = (fStack_284 * fVar425 +
              fVar352 * fVar465 + fStack_2d4 * fVar442 + fStack_304 * fVar285) * fVar452;
    fVar437 = (fStack_280 * fVar432 +
              fVar352 * fVar468 + fStack_2d0 * fVar447 + fStack_300 * fVar317) * fVar452;
    fVar440 = (fStack_27c * fVar436 +
              fVar352 * fVar282 + fStack_2cc * fVar449 + fStack_2fc * fVar349) * fVar452;
    fVar453 = (fVar350 * fVar459 + local_2b8 * fVar379 + local_2e8 * fVar431 + local_318 * fVar404)
              * fVar452;
    fVar460 = (fVar350 * fVar425 +
              fStack_2b4 * fVar465 + fStack_2e4 * fVar442 + fStack_314 * fVar285) * fVar452;
    fVar463 = (fVar350 * fVar432 +
              fStack_2b0 * fVar468 + fStack_2e0 * fVar447 + fStack_310 * fVar317) * fVar452;
    fVar466 = (fVar350 * fVar436 +
              fStack_2ac * fVar282 + fStack_2dc * fVar449 + fStack_30c * fVar349) * fVar452;
    fVar407 = fVar452 * (fVar425 * fStack_294 +
                        fVar465 * fVar366 + fVar442 * fStack_2f4 + fVar285 * fStack_324);
    fVar413 = fVar452 * (fVar432 * fStack_290 +
                        fVar468 * fVar366 + fVar447 * fStack_2f0 + fVar317 * fStack_320);
    fVar414 = fVar452 * (fVar436 * fStack_28c +
                        fVar282 * fVar366 + fVar449 * fStack_2ec + fVar349 * fStack_31c);
    auVar474._4_4_ = auVar253._8_4_;
    auVar474._0_4_ = fVar462;
    auVar474._8_4_ = auVar253._12_4_;
    auVar474._12_4_ = 0;
    auVar372._0_8_ = CONCAT44(auVar253._8_4_ - fVar413,fVar462 - fVar407);
    auVar372._8_4_ = auVar253._12_4_ - fVar414;
    auVar372._12_4_ = 0;
    fVar469 = fVar478 - fVar473;
    fVar470 = fVar479 - fVar478;
    fVar471 = fVar480 - fVar479;
    fVar472 = 0.0 - fVar480;
    fVar351 = fVar280 - fVar259;
    fVar353 = fVar283 - fVar280;
    fVar355 = fVar286 - fVar283;
    fVar367 = 0.0 - fVar286;
    fVar368 = fVar426 * fVar351 - fVar453 * fVar469;
    fVar370 = fVar433 * fVar353 - fVar460 * fVar470;
    fVar399 = fVar437 * fVar355 - fVar463 * fVar471;
    fVar401 = fVar440 * fVar367 - fVar466 * fVar472;
    fVar443 = fStack_504 - local_508;
    fVar448 = fStack_500 - fStack_504;
    fVar450 = fStack_4fc - fStack_500;
    fVar451 = 0.0 - fStack_4fc;
    fVar432 = fVar453 * fVar443 - fVar416 * fVar351;
    fVar465 = fVar460 * fVar448 - fVar421 * fVar353;
    fVar282 = fVar463 * fVar450 - fVar422 * fVar355;
    fVar317 = fVar466 * fVar451 - fVar423 * fVar367;
    fVar415 = fVar416 * fVar469 - fVar426 * fVar443;
    fVar400 = fVar421 * fVar470 - fVar433 * fVar448;
    fVar402 = fVar422 * fVar471 - fVar437 * fVar450;
    fVar405 = fVar423 * fVar472 - fVar440 * fVar451;
    auVar232._0_4_ = fVar351 * fVar351;
    auVar232._4_4_ = fVar353 * fVar353;
    auVar232._8_4_ = fVar355 * fVar355;
    auVar232._12_4_ = fVar367 * fVar367;
    auVar391._0_4_ = fVar443 * fVar443 + fVar469 * fVar469 + auVar232._0_4_;
    auVar391._4_4_ = fVar448 * fVar448 + fVar470 * fVar470 + auVar232._4_4_;
    auVar391._8_4_ = fVar450 * fVar450 + fVar471 * fVar471 + auVar232._8_4_;
    auVar391._12_4_ = fVar451 * fVar451 + fVar472 * fVar472 + auVar232._12_4_;
    auVar168 = rcpps(auVar232,auVar391);
    fVar442 = auVar168._0_4_;
    fVar447 = auVar168._4_4_;
    fVar449 = auVar168._8_4_;
    fVar425 = auVar168._12_4_;
    fVar442 = (1.0 - fVar442 * auVar391._0_4_) * fVar442 + fVar442;
    fVar447 = (1.0 - fVar447 * auVar391._4_4_) * fVar447 + fVar447;
    fVar449 = (1.0 - fVar449 * auVar391._8_4_) * fVar449 + fVar449;
    fVar425 = (1.0 - fVar425 * auVar391._12_4_) * fVar425 + fVar425;
    fVar436 = fVar351 * fVar433 - fVar469 * fVar460;
    fVar468 = fVar353 * fVar437 - fVar470 * fVar463;
    fVar285 = fVar355 * fVar440 - fVar471 * fVar466;
    fVar349 = fVar367 * 0.0 - fVar472 * 0.0;
    fVar427 = fVar443 * fVar460 - fVar351 * fVar421;
    fVar434 = fVar448 * fVar463 - fVar353 * fVar422;
    fVar438 = fVar450 * fVar466 - fVar355 * fVar423;
    fVar441 = fVar451 * 0.0 - fVar367 * 0.0;
    fVar454 = fVar469 * fVar421 - fVar443 * fVar433;
    fVar461 = fVar470 * fVar422 - fVar448 * fVar437;
    fVar464 = fVar471 * fVar423 - fVar450 * fVar440;
    fVar467 = fVar472 * 0.0 - fVar451 * 0.0;
    auVar339._0_4_ = (fVar368 * fVar368 + fVar432 * fVar432 + fVar415 * fVar415) * fVar442;
    auVar339._4_4_ = (fVar370 * fVar370 + fVar465 * fVar465 + fVar400 * fVar400) * fVar447;
    auVar339._8_4_ = (fVar399 * fVar399 + fVar282 * fVar282 + fVar402 * fVar402) * fVar449;
    auVar339._12_4_ = (fVar401 * fVar401 + fVar317 * fVar317 + fVar405 * fVar405) * fVar425;
    auVar264._0_4_ = (fVar436 * fVar436 + fVar427 * fVar427 + fVar454 * fVar454) * fVar442;
    auVar264._4_4_ = (fVar468 * fVar468 + fVar434 * fVar434 + fVar461 * fVar461) * fVar447;
    auVar264._8_4_ = (fVar285 * fVar285 + fVar438 * fVar438 + fVar464 * fVar464) * fVar449;
    auVar264._12_4_ = (fVar349 * fVar349 + fVar441 * fVar441 + fVar467 * fVar467) * fVar425;
    auVar340 = maxps(auVar339,auVar264);
    auVar356._0_4_ =
         fVar452 * (fVar459 * local_298 +
                   fVar379 * fVar366 + fVar431 * local_2f8 + fVar404 * local_328) + fVar439;
    auVar356._4_4_ = fVar407 + fVar462;
    auVar356._8_4_ = fVar413 + auVar253._8_4_;
    auVar356._12_4_ = fVar414 + auVar253._12_4_;
    auVar456._8_4_ = auVar253._8_4_;
    auVar456._0_8_ = auVar253._0_8_;
    auVar456._12_4_ = auVar253._12_4_;
    auVar168 = maxps(auVar456,auVar356);
    auVar265._8_4_ = auVar372._8_4_;
    auVar265._0_8_ = auVar372._0_8_;
    auVar265._12_4_ = 0;
    auVar262 = maxps(auVar265,auVar474);
    auVar457 = maxps(auVar168,auVar262);
    auVar168 = minps(auVar253,auVar356);
    auVar373 = minps(auVar372,auVar474);
    auVar168 = minps(auVar168,auVar373);
    auVar262 = sqrtps(auVar262,auVar340);
    auVar340 = rsqrtps(auVar262,auVar391);
    fVar431 = auVar340._0_4_;
    fVar442 = auVar340._4_4_;
    fVar447 = auVar340._8_4_;
    fVar449 = auVar340._12_4_;
    local_368._0_4_ = fVar431 * 1.5 - fVar431 * fVar431 * auVar391._0_4_ * 0.5 * fVar431;
    local_368._4_4_ = fVar442 * 1.5 - fVar442 * fVar442 * auVar391._4_4_ * 0.5 * fVar442;
    fStack_360 = fVar447 * 1.5 - fVar447 * fVar447 * auVar391._8_4_ * 0.5 * fVar447;
    fStack_35c = fVar449 * 1.5 - fVar449 * fVar449 * auVar391._12_4_ * 0.5 * fVar449;
    fVar431 = 0.0 - fVar473;
    fVar442 = 0.0 - fVar478;
    fVar447 = 0.0 - fVar479;
    fVar449 = 0.0 - fVar480;
    fVar413 = 0.0 - fVar259;
    fVar414 = 0.0 - fVar280;
    fVar415 = 0.0 - fVar283;
    fVar400 = 0.0 - fVar286;
    fVar452 = 0.0 - local_508;
    fVar459 = 0.0 - fStack_504;
    fVar425 = 0.0 - fStack_500;
    fVar432 = 0.0 - fStack_4fc;
    fVar468 = fVar249 * fVar443 * (float)local_368._0_4_ +
              fVar250 * fVar469 * (float)local_368._0_4_ +
              fVar279 * fVar351 * (float)local_368._0_4_;
    fVar282 = fVar249 * fVar448 * (float)local_368._4_4_ +
              fVar250 * fVar470 * (float)local_368._4_4_ +
              fVar279 * fVar353 * (float)local_368._4_4_;
    fVar285 = fVar249 * fVar450 * fStack_360 +
              fVar250 * fVar471 * fStack_360 + fVar279 * fVar355 * fStack_360;
    fVar317 = fVar249 * fVar451 * fStack_35c +
              fVar250 * fVar472 * fStack_35c + fVar279 * fVar367 * fStack_35c;
    local_378 = fVar443 * (float)local_368._0_4_ * fVar452 +
                fVar469 * (float)local_368._0_4_ * fVar431 +
                fVar351 * (float)local_368._0_4_ * fVar413;
    fStack_374 = fVar448 * (float)local_368._4_4_ * fVar459 +
                 fVar470 * (float)local_368._4_4_ * fVar442 +
                 fVar353 * (float)local_368._4_4_ * fVar414;
    fStack_370 = fVar450 * fStack_360 * fVar425 +
                 fVar471 * fStack_360 * fVar447 + fVar355 * fStack_360 * fVar415;
    fStack_36c = fVar451 * fStack_35c * fVar432 +
                 fVar472 * fStack_35c * fVar449 + fVar367 * fStack_35c * fVar400;
    fVar402 = (fVar249 * fVar452 + fVar250 * fVar431 + fVar279 * fVar413) - fVar468 * local_378;
    fVar405 = (fVar249 * fVar459 + fVar250 * fVar442 + fVar279 * fVar414) - fVar282 * fStack_374;
    fVar427 = (fVar249 * fVar425 + fVar250 * fVar447 + fVar279 * fVar415) - fVar285 * fStack_370;
    fVar434 = (fVar249 * fVar432 + fVar250 * fVar449 + fVar279 * fVar400) - fVar317 * fStack_36c;
    fVar349 = (fVar452 * fVar452 + fVar431 * fVar431 + fVar413 * fVar413) - local_378 * local_378;
    fVar368 = (fVar459 * fVar459 + fVar442 * fVar442 + fVar414 * fVar414) - fStack_374 * fStack_374;
    fVar399 = (fVar425 * fVar425 + fVar447 * fVar447 + fVar415 * fVar415) - fStack_370 * fStack_370;
    fVar404 = (fVar432 * fVar432 + fVar449 * fVar449 + fVar400 * fVar400) - fStack_36c * fStack_36c;
    fVar436 = (auVar457._0_4_ + auVar262._0_4_) * 1.0000002;
    fVar439 = (auVar457._4_4_ + auVar262._4_4_) * 1.0000002;
    fVar462 = (auVar457._8_4_ + auVar262._8_4_) * 1.0000002;
    fVar465 = (auVar457._12_4_ + auVar262._12_4_) * 1.0000002;
    fVar438 = fVar349 - fVar436 * fVar436;
    fVar441 = fVar368 - fVar439 * fVar439;
    fVar454 = fVar399 - fVar462 * fVar462;
    fVar461 = fVar404 - fVar465 * fVar465;
    fVar379 = fVar247 - fVar468 * fVar468;
    fVar370 = fVar248 - fVar282 * fVar282;
    fVar401 = fVar314 - fVar285 * fVar285;
    fVar407 = fVar424 - fVar317 * fVar317;
    fVar402 = fVar402 + fVar402;
    fVar405 = fVar405 + fVar405;
    fVar427 = fVar427 + fVar427;
    fVar434 = fVar434 + fVar434;
    auVar181._0_4_ = fVar379 * 4.0;
    auVar181._4_4_ = fVar370 * 4.0;
    auVar181._8_4_ = fVar401 * 4.0;
    auVar181._12_4_ = fVar407 * 4.0;
    auVar475._0_4_ = fVar402 * fVar402 - auVar181._0_4_ * fVar438;
    auVar475._4_4_ = fVar405 * fVar405 - auVar181._4_4_ * fVar441;
    auVar475._8_4_ = fVar427 * fVar427 - auVar181._8_4_ * fVar454;
    auVar475._12_4_ = fVar434 * fVar434 - auVar181._12_4_ * fVar461;
    auVar374._4_4_ = -(uint)(0.0 <= auVar475._4_4_);
    auVar374._0_4_ = -(uint)(0.0 <= auVar475._0_4_);
    auVar374._8_4_ = -(uint)(0.0 <= auVar475._8_4_);
    auVar374._12_4_ = -(uint)(0.0 <= auVar475._12_4_);
    iVar153 = movmskps((int)pSVar131,auVar374);
    fStack_510 = -fVar427;
    fStack_50c = -fVar434;
    uVar147 = (uint)DAT_01f46710;
    uVar149 = DAT_01f46710._4_4_;
    uVar369 = DAT_01f46710._8_4_;
    uVar371 = DAT_01f46710._12_4_;
    auVar458._0_4_ = (uint)(fVar468 * fVar468) & uVar147;
    auVar458._4_4_ = (uint)(fVar282 * fVar282) & uVar149;
    auVar458._8_4_ = (uint)(fVar285 * fVar285) & uVar369;
    auVar458._12_4_ = (uint)(fVar317 * fVar317) & uVar371;
    fVar436 = (float)((uint)fVar379 & uVar147);
    fVar439 = (float)((uint)fVar370 & uVar149);
    fVar462 = (float)((uint)fVar401 & uVar369);
    fVar465 = (float)((uint)fVar407 & uVar371);
    local_518 = (undefined1  [8])(CONCAT44(fVar405,fVar402) ^ 0x8000000080000000);
    if (iVar153 == 0) {
      iVar153 = 0;
      auVar392 = _DAT_01f45a30;
      auVar409 = _DAT_01f45a40;
    }
    else {
      auVar340 = sqrtps(auVar181,auVar475);
      bVar142 = 0.0 <= auVar475._0_4_;
      uVar144 = -(uint)bVar142;
      bVar32 = 0.0 <= auVar475._4_4_;
      uVar146 = -(uint)bVar32;
      bVar33 = 0.0 <= auVar475._8_4_;
      uVar148 = -(uint)bVar33;
      bVar34 = 0.0 <= auVar475._12_4_;
      uVar150 = -(uint)bVar34;
      auVar266._0_4_ = fVar379 + fVar379;
      auVar266._4_4_ = fVar370 + fVar370;
      auVar266._8_4_ = fVar401 + fVar401;
      auVar266._12_4_ = fVar407 + fVar407;
      auVar373 = rcpps(_DAT_01f46710,auVar266);
      fVar464 = auVar373._0_4_;
      fVar467 = auVar373._4_4_;
      fVar403 = auVar373._8_4_;
      fVar406 = auVar373._12_4_;
      fVar464 = (1.0 - auVar266._0_4_ * fVar464) * fVar464 + fVar464;
      fVar467 = (1.0 - auVar266._4_4_ * fVar467) * fVar467 + fVar467;
      fVar403 = (1.0 - auVar266._8_4_ * fVar403) * fVar403 + fVar403;
      fVar406 = (1.0 - auVar266._12_4_ * fVar406) * fVar406 + fVar406;
      fVar260 = (-fVar402 - auVar340._0_4_) * fVar464;
      fVar281 = (-fVar405 - auVar340._4_4_) * fVar467;
      fVar284 = (fStack_510 - auVar340._8_4_) * fVar403;
      fVar287 = (fStack_50c - auVar340._12_4_) * fVar406;
      fVar464 = (auVar340._0_4_ - fVar402) * fVar464;
      fVar467 = (auVar340._4_4_ - fVar405) * fVar467;
      fVar403 = (auVar340._8_4_ - fVar427) * fVar403;
      fVar406 = (auVar340._12_4_ - fVar434) * fVar406;
      local_1e8 = (fVar468 * fVar260 + local_378) * (float)local_368._0_4_;
      fStack_1e4 = (fVar282 * fVar281 + fStack_374) * (float)local_368._4_4_;
      fStack_1e0 = (fVar285 * fVar284 + fStack_370) * fStack_360;
      fStack_1dc = (fVar317 * fVar287 + fStack_36c) * fStack_35c;
      local_1d8 = (fVar468 * fVar464 + local_378) * (float)local_368._0_4_;
      fStack_1d4 = (fVar282 * fVar467 + fStack_374) * (float)local_368._4_4_;
      fStack_1d0 = (fVar285 * fVar403 + fStack_370) * fStack_360;
      fStack_1cc = (fVar317 * fVar406 + fStack_36c) * fStack_35c;
      auVar267._0_4_ = (uint)fVar260 & uVar144;
      auVar267._4_4_ = (uint)fVar281 & uVar146;
      auVar267._8_4_ = (uint)fVar284 & uVar148;
      auVar267._12_4_ = (uint)fVar287 & uVar150;
      auVar392._0_8_ = CONCAT44(~uVar146,~uVar144) & 0x7f8000007f800000;
      auVar392._8_4_ = ~uVar148 & 0x7f800000;
      auVar392._12_4_ = ~uVar150 & 0x7f800000;
      auVar392 = auVar392 | auVar267;
      auVar182._0_4_ = (uint)fVar464 & uVar144;
      auVar182._4_4_ = (uint)fVar467 & uVar146;
      auVar182._8_4_ = (uint)fVar403 & uVar148;
      auVar182._12_4_ = (uint)fVar406 & uVar150;
      auVar409._0_8_ = CONCAT44(~uVar146,~uVar144) & 0xff800000ff800000;
      auVar409._8_4_ = ~uVar148 & 0xff800000;
      auVar409._12_4_ = ~uVar150 & 0xff800000;
      auVar409 = auVar409 | auVar182;
      auVar82._4_4_ = fStack_334;
      auVar82._0_4_ = local_338;
      auVar82._8_4_ = fStack_330;
      auVar82._12_4_ = fStack_32c;
      auVar340 = maxps(auVar82,auVar458);
      fVar464 = auVar340._0_4_ * 1.9073486e-06;
      fVar467 = auVar340._4_4_ * 1.9073486e-06;
      fVar403 = auVar340._8_4_ * 1.9073486e-06;
      fVar406 = auVar340._12_4_ * 1.9073486e-06;
      auVar429._0_4_ = -(uint)(fVar436 < fVar464 && bVar142);
      auVar429._4_4_ = -(uint)(fVar439 < fVar467 && bVar32);
      auVar429._8_4_ = -(uint)(fVar462 < fVar403 && bVar33);
      auVar429._12_4_ = -(uint)(fVar465 < fVar406 && bVar34);
      iVar153 = movmskps(iVar153,auVar429);
      if (iVar153 != 0) {
        uVar144 = -(uint)(fVar438 <= 0.0);
        uVar146 = -(uint)(fVar441 <= 0.0);
        uVar148 = -(uint)(fVar454 <= 0.0);
        uVar150 = -(uint)(fVar461 <= 0.0);
        auVar277._0_4_ = (uVar144 & 0xff800000 | ~uVar144 & 0x7f800000) & auVar429._0_4_;
        auVar277._4_4_ = (uVar146 & 0xff800000 | ~uVar146 & 0x7f800000) & auVar429._4_4_;
        auVar277._8_4_ = (uVar148 & 0xff800000 | ~uVar148 & 0x7f800000) & auVar429._8_4_;
        auVar277._12_4_ = (uVar150 & 0xff800000 | ~uVar150 & 0x7f800000) & auVar429._12_4_;
        auVar343._0_4_ = ~auVar429._0_4_ & auVar392._0_4_;
        auVar343._4_4_ = ~auVar429._4_4_ & auVar392._4_4_;
        auVar343._8_4_ = ~auVar429._8_4_ & auVar392._8_4_;
        auVar343._12_4_ = ~auVar429._12_4_ & auVar392._12_4_;
        auVar392 = auVar343 | auVar277;
        auVar377._0_4_ = (uVar144 & 0x7f800000 | ~uVar144 & 0xff800000) & auVar429._0_4_;
        auVar377._4_4_ = (uVar146 & 0x7f800000 | ~uVar146 & 0xff800000) & auVar429._4_4_;
        auVar377._8_4_ = (uVar148 & 0x7f800000 | ~uVar148 & 0xff800000) & auVar429._8_4_;
        auVar377._12_4_ = (uVar150 & 0x7f800000 | ~uVar150 & 0xff800000) & auVar429._12_4_;
        auVar430._0_4_ = ~auVar429._0_4_ & auVar409._0_4_;
        auVar430._4_4_ = ~auVar429._4_4_ & auVar409._4_4_;
        auVar430._8_4_ = ~auVar429._8_4_ & auVar409._8_4_;
        auVar430._12_4_ = ~auVar429._12_4_ & auVar409._12_4_;
        auVar409 = auVar430 | auVar377;
        auVar374._4_4_ = -(uint)((fVar467 <= fVar439 || fVar441 <= 0.0) && bVar32);
        auVar374._0_4_ = -(uint)((fVar464 <= fVar436 || fVar438 <= 0.0) && bVar142);
        auVar374._8_4_ = -(uint)((fVar403 <= fVar462 || fVar454 <= 0.0) && bVar33);
        auVar374._12_4_ = -(uint)((fVar406 <= fVar465 || fVar461 <= 0.0) && bVar34);
      }
    }
    auVar375._0_4_ = (auVar374._0_4_ << 0x1f) >> 0x1f;
    auVar375._4_4_ = (auVar374._4_4_ << 0x1f) >> 0x1f;
    auVar375._8_4_ = (auVar374._8_4_ << 0x1f) >> 0x1f;
    auVar375._12_4_ = (auVar374._12_4_ << 0x1f) >> 0x1f;
    auVar375 = auVar375 & auVar231;
    iVar153 = movmskps(iVar153,auVar375);
    pRVar136 = pRVar135;
    if (iVar153 != 0) {
      auVar357._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_358._0_4_;
      auVar357._4_4_ = auVar357._0_4_;
      auVar357._8_4_ = auVar357._0_4_;
      auVar357._12_4_ = auVar357._0_4_;
      auVar373 = maxps(auVar357,auVar392);
      auVar476._0_4_ = (ray->super_RayK<1>).tfar - (float)local_358._0_4_;
      auVar476._4_4_ = auVar476._0_4_;
      auVar476._8_4_ = auVar476._0_4_;
      auVar476._12_4_ = auVar476._0_4_;
      auVar457 = minps(auVar476,auVar409);
      auVar183._0_4_ = fVar426 * fVar250 + fVar453 * fVar279;
      auVar183._4_4_ = fVar433 * fVar250 + fVar460 * fVar279;
      auVar183._8_4_ = fVar437 * fVar250 + fVar463 * fVar279;
      auVar183._12_4_ = fVar440 * fVar250 + fVar466 * fVar279;
      auVar445._0_4_ = fVar416 * fVar249 + auVar183._0_4_;
      auVar445._4_4_ = fVar421 * fVar249 + auVar183._4_4_;
      auVar445._8_4_ = fVar422 * fVar249 + auVar183._8_4_;
      auVar445._12_4_ = fVar423 * fVar249 + auVar183._12_4_;
      auVar340 = rcpps(auVar183,auVar445);
      fVar438 = auVar340._0_4_;
      fVar441 = auVar340._4_4_;
      fVar454 = auVar340._8_4_;
      fVar461 = auVar340._12_4_;
      fVar464 = (float)DAT_01f46a60;
      fVar467 = DAT_01f46a60._4_4_;
      fVar403 = DAT_01f46a60._12_4_;
      fVar406 = DAT_01f46a60._8_4_;
      bVar142 = (float)((uint)auVar445._0_4_ & uVar147) < 1e-18;
      bVar32 = (float)((uint)auVar445._4_4_ & uVar149) < 1e-18;
      bVar33 = (float)((uint)auVar445._8_4_ & uVar369) < 1e-18;
      bVar34 = (float)((uint)auVar445._12_4_ & uVar371) < 1e-18;
      fVar431 = ((fVar464 - auVar445._0_4_ * fVar438) * fVar438 + fVar438) *
                -(fVar452 * fVar416 + fVar431 * fVar426 + fVar413 * fVar453);
      fVar442 = ((fVar467 - auVar445._4_4_ * fVar441) * fVar441 + fVar441) *
                -(fVar459 * fVar421 + fVar442 * fVar433 + fVar414 * fVar460);
      fVar447 = ((fVar406 - auVar445._8_4_ * fVar454) * fVar454 + fVar454) *
                -(fVar425 * fVar422 + fVar447 * fVar437 + fVar415 * fVar463);
      fVar449 = ((fVar403 - auVar445._12_4_ * fVar461) * fVar461 + fVar461) *
                -(fVar432 * fVar423 + fVar449 * fVar440 + fVar400 * fVar466);
      uVar144 = -(uint)(auVar445._0_4_ < 0.0 || bVar142);
      uVar146 = -(uint)(auVar445._4_4_ < 0.0 || bVar32);
      uVar148 = -(uint)(auVar445._8_4_ < 0.0 || bVar33);
      uVar150 = -(uint)(auVar445._12_4_ < 0.0 || bVar34);
      auVar341._0_8_ = CONCAT44(uVar146,uVar144) & 0xff800000ff800000;
      auVar341._8_4_ = uVar148 & 0xff800000;
      auVar341._12_4_ = uVar150 & 0xff800000;
      auVar184._0_4_ = ~uVar144 & (uint)fVar431;
      auVar184._4_4_ = ~uVar146 & (uint)fVar442;
      auVar184._8_4_ = ~uVar148 & (uint)fVar447;
      auVar184._12_4_ = ~uVar150 & (uint)fVar449;
      auVar373 = maxps(auVar373,auVar184 | auVar341);
      uVar144 = -(uint)(0.0 < auVar445._0_4_ || bVar142);
      uVar146 = -(uint)(0.0 < auVar445._4_4_ || bVar32);
      uVar148 = -(uint)(0.0 < auVar445._8_4_ || bVar33);
      uVar150 = -(uint)(0.0 < auVar445._12_4_ || bVar34);
      auVar185._0_8_ = CONCAT44(uVar146,uVar144) & 0x7f8000007f800000;
      auVar185._8_4_ = uVar148 & 0x7f800000;
      auVar185._12_4_ = uVar150 & 0x7f800000;
      auVar446._0_4_ = ~uVar144 & (uint)fVar431;
      auVar446._4_4_ = ~uVar146 & (uint)fVar442;
      auVar446._8_4_ = ~uVar148 & (uint)fVar447;
      auVar446._12_4_ = ~uVar150 & (uint)fVar449;
      auVar457 = minps(auVar457,auVar446 | auVar185);
      auVar268._0_4_ = (0.0 - fVar478) * -fVar433 + (0.0 - fVar280) * -fVar460;
      auVar268._4_4_ = (0.0 - fVar479) * -fVar437 + (0.0 - fVar283) * -fVar463;
      auVar268._8_4_ = (0.0 - fVar480) * -fVar440 + (0.0 - fVar286) * -fVar466;
      auVar268._12_4_ = 0x80000000;
      auVar233._0_4_ = -fVar421 * fVar249 + -fVar433 * fVar250 + -fVar460 * fVar279;
      auVar233._4_4_ = -fVar422 * fVar249 + -fVar437 * fVar250 + -fVar463 * fVar279;
      auVar233._8_4_ = -fVar423 * fVar249 + -fVar440 * fVar250 + -fVar466 * fVar279;
      auVar233._12_4_ = fVar249 * -0.0 + fVar250 * -0.0 + fVar279 * -0.0;
      auVar340 = rcpps(auVar268,auVar233);
      fVar431 = auVar340._0_4_;
      fVar442 = auVar340._4_4_;
      fVar447 = auVar340._8_4_;
      fVar449 = auVar340._12_4_;
      bVar142 = (float)((uint)auVar233._0_4_ & uVar147) < 1e-18;
      bVar32 = (float)((uint)auVar233._4_4_ & uVar149) < 1e-18;
      bVar33 = (float)((uint)auVar233._8_4_ & uVar369) < 1e-18;
      bVar34 = (float)((uint)auVar233._12_4_ & uVar371) < 1e-18;
      fVar431 = ((fVar464 - auVar233._0_4_ * fVar431) * fVar431 + fVar431) *
                -((0.0 - fStack_504) * -fVar421 + auVar268._0_4_);
      fVar442 = ((fVar467 - auVar233._4_4_ * fVar442) * fVar442 + fVar442) *
                -((0.0 - fStack_500) * -fVar422 + auVar268._4_4_);
      fVar447 = ((fVar406 - auVar233._8_4_ * fVar447) * fVar447 + fVar447) *
                -((0.0 - fStack_4fc) * -fVar423 + auVar268._8_4_);
      fVar449 = ((fVar403 - auVar233._12_4_ * fVar449) * fVar449 + fVar449) * 0.0;
      uVar144 = -(uint)(auVar233._0_4_ < 0.0 || bVar142);
      uVar146 = -(uint)(auVar233._4_4_ < 0.0 || bVar32);
      uVar148 = -(uint)(auVar233._8_4_ < 0.0 || bVar33);
      uVar150 = -(uint)(auVar233._12_4_ < 0.0 || bVar34);
      auVar269._0_8_ = CONCAT44(uVar146,uVar144) & 0xff800000ff800000;
      auVar269._8_4_ = uVar148 & 0xff800000;
      auVar269._12_4_ = uVar150 & 0xff800000;
      auVar186._0_4_ = ~uVar144 & (uint)fVar431;
      auVar186._4_4_ = ~uVar146 & (uint)fVar442;
      auVar186._8_4_ = ~uVar148 & (uint)fVar447;
      auVar186._12_4_ = ~uVar150 & (uint)fVar449;
      auVar340 = maxps(auVar373,auVar186 | auVar269);
      uVar144 = -(uint)(0.0 < auVar233._0_4_ || bVar142);
      uVar146 = -(uint)(0.0 < auVar233._4_4_ || bVar32);
      uVar148 = -(uint)(0.0 < auVar233._8_4_ || bVar33);
      uVar150 = -(uint)(0.0 < auVar233._12_4_ || bVar34);
      auVar410._0_8_ = CONCAT44(uVar146,uVar144) & 0x7f8000007f800000;
      auVar410._8_4_ = uVar148 & 0x7f800000;
      auVar410._12_4_ = uVar150 & 0x7f800000;
      auVar234._0_4_ = ~uVar144 & (uint)fVar431;
      auVar234._4_4_ = ~uVar146 & (uint)fVar442;
      auVar234._8_4_ = ~uVar148 & (uint)fVar447;
      auVar234._12_4_ = ~uVar150 & (uint)fVar449;
      aVar477 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar457,auVar234 | auVar410);
      fVar449 = auVar340._12_4_;
      fVar431 = auVar340._0_4_;
      fVar442 = auVar340._4_4_;
      fVar447 = auVar340._8_4_;
      auVar187._0_4_ = -(uint)(fVar431 <= aVar477.v[0]) & auVar375._0_4_;
      auVar187._4_4_ = -(uint)(fVar442 <= aVar477.v[1]) & auVar375._4_4_;
      auVar187._8_4_ = -(uint)(fVar447 <= aVar477.v[2]) & auVar375._8_4_;
      auVar187._12_4_ = -(uint)(fVar449 <= aVar477.v[3]) & auVar375._12_4_;
      iVar153 = movmskps(iVar153,auVar187);
      if (iVar153 != 0) {
        auVar79._4_4_ = (auVar168._4_4_ - auVar262._4_4_) * 0.99999976;
        auVar79._0_4_ = (auVar168._0_4_ - auVar262._0_4_) * 0.99999976;
        auVar79._8_4_ = (auVar168._8_4_ - auVar262._8_4_) * 0.99999976;
        auVar79._12_4_ = (auVar168._12_4_ - auVar262._12_4_) * 0.99999976;
        auVar168 = maxps(ZEXT816(0),auVar79);
        auVar84._4_4_ = fStack_1e4;
        auVar84._0_4_ = local_1e8;
        auVar84._8_4_ = fStack_1e0;
        auVar84._12_4_ = fStack_1dc;
        auVar262 = minps(auVar84,_DAT_01f46a60);
        auVar302._0_12_ = ZEXT812(0);
        auVar302._12_4_ = 0.0;
        auVar373 = maxps(auVar262,auVar302);
        auVar85._4_4_ = fStack_1d4;
        auVar85._0_4_ = local_1d8;
        auVar85._8_4_ = fStack_1d0;
        auVar85._12_4_ = fStack_1cc;
        auVar262 = minps(auVar85,_DAT_01f46a60);
        auVar262 = maxps(auVar262,auVar302);
        local_108[0] = (auVar373._0_4_ + 0.0) * 0.25 * fVar354 + fVar435;
        local_108[1] = (auVar373._4_4_ + 1.0) * 0.25 * fVar354 + fVar435;
        local_108[2] = (auVar373._8_4_ + 2.0) * 0.25 * fVar354 + fVar435;
        local_108[3] = (auVar373._12_4_ + 3.0) * 0.25 * fVar354 + fVar435;
        auVar358._0_4_ = (auVar262._0_4_ + 0.0) * 0.25 * fVar354 + fVar435;
        auVar358._4_4_ = (auVar262._4_4_ + 1.0) * 0.25 * fVar354 + fVar435;
        auVar358._8_4_ = (auVar262._8_4_ + 2.0) * 0.25 * fVar354 + fVar435;
        auVar358._12_4_ = (auVar262._12_4_ + 3.0) * 0.25 * fVar354 + fVar435;
        auVar254._0_4_ = fVar349 - auVar168._0_4_ * auVar168._0_4_;
        auVar254._4_4_ = fVar368 - auVar168._4_4_ * auVar168._4_4_;
        auVar254._8_4_ = fVar399 - auVar168._8_4_ * auVar168._8_4_;
        auVar254._12_4_ = fVar404 - auVar168._12_4_ * auVar168._12_4_;
        auVar342._0_4_ = fVar402 * fVar402 - auVar181._0_4_ * auVar254._0_4_;
        auVar342._4_4_ = fVar405 * fVar405 - auVar181._4_4_ * auVar254._4_4_;
        auVar342._8_4_ = fVar427 * fVar427 - auVar181._8_4_ * auVar254._8_4_;
        auVar342._12_4_ = fVar434 * fVar434 - auVar181._12_4_ * auVar254._12_4_;
        auVar270._4_4_ = -(uint)(0.0 <= auVar342._4_4_);
        auVar270._0_4_ = -(uint)(0.0 <= auVar342._0_4_);
        auVar270._8_4_ = -(uint)(0.0 <= auVar342._8_4_);
        auVar270._12_4_ = -(uint)(0.0 <= auVar342._12_4_);
        iVar153 = movmskps(iVar153,auVar270);
        if (iVar153 == 0) {
          fVar452 = 0.0;
          fVar459 = 0.0;
          fVar425 = 0.0;
          fVar432 = 0.0;
          fVar468 = 0.0;
          fVar259 = 0.0;
          fVar280 = 0.0;
          fVar282 = 0.0;
          _local_598 = ZEXT816(0);
          _local_5a8 = ZEXT816(0);
          _local_518 = ZEXT816(0);
          iVar153 = 0;
          auVar376 = _DAT_01f45a40;
          auVar393 = _DAT_01f45a30;
        }
        else {
          auVar262 = sqrtps(auVar358,auVar342);
          auVar235._0_4_ = fVar379 + fVar379;
          auVar235._4_4_ = fVar370 + fVar370;
          auVar235._8_4_ = fVar401 + fVar401;
          auVar235._12_4_ = fVar407 + fVar407;
          auVar168 = rcpps(auVar254,auVar235);
          fVar399 = auVar168._0_4_;
          fVar401 = auVar168._4_4_;
          fVar354 = auVar168._8_4_;
          fVar404 = auVar168._12_4_;
          fVar399 = (fVar464 - auVar235._0_4_ * fVar399) * fVar399 + fVar399;
          fVar401 = (fVar467 - auVar235._4_4_ * fVar401) * fVar401 + fVar401;
          fVar354 = (fVar406 - auVar235._8_4_ * fVar354) * fVar354 + fVar354;
          fVar404 = (fVar403 - auVar235._12_4_ * fVar404) * fVar404 + fVar404;
          fVar349 = ((float)local_518._0_4_ - auVar262._0_4_) * fVar399;
          fVar379 = ((float)local_518._4_4_ - auVar262._4_4_) * fVar401;
          fVar368 = (fStack_510 - auVar262._8_4_) * fVar354;
          fVar370 = (fStack_50c - auVar262._12_4_) * fVar404;
          fVar399 = (auVar262._0_4_ - fVar402) * fVar399;
          fVar401 = (auVar262._4_4_ - fVar405) * fVar401;
          fVar354 = (auVar262._8_4_ - fVar427) * fVar354;
          fVar404 = (auVar262._12_4_ - fVar434) * fVar404;
          fVar452 = (fVar468 * fVar349 + local_378) * (float)local_368._0_4_;
          fVar459 = (fVar282 * fVar379 + fStack_374) * (float)local_368._4_4_;
          fVar425 = (fVar285 * fVar368 + fStack_370) * fStack_360;
          fVar432 = (fVar317 * fVar370 + fStack_36c) * fStack_35c;
          local_598._4_4_ = fVar249 * fVar379 - (fVar448 * fVar459 + fStack_504);
          local_598._0_4_ = fVar249 * fVar349 - (fVar443 * fVar452 + local_508);
          fStack_590 = fVar249 * fVar368 - (fVar450 * fVar425 + fStack_500);
          fStack_58c = fVar249 * fVar370 - (fVar451 * fVar432 + fStack_4fc);
          local_5a8._4_4_ = fVar250 * fVar379 - (fVar470 * fVar459 + fVar478);
          local_5a8._0_4_ = fVar250 * fVar349 - (fVar469 * fVar452 + fVar473);
          fStack_5a0 = fVar250 * fVar368 - (fVar471 * fVar425 + fVar479);
          fStack_59c = fVar250 * fVar370 - (fVar472 * fVar432 + fVar480);
          local_518._4_4_ = fVar279 * fVar379 - (fVar459 * fVar353 + fVar280);
          local_518._0_4_ = fVar279 * fVar349 - (fVar452 * fVar351 + fVar259);
          fStack_510 = fVar279 * fVar368 - (fVar425 * fVar355 + fVar283);
          fStack_50c = fVar279 * fVar370 - (fVar432 * fVar367 + fVar286);
          local_368._0_4_ = (fVar468 * fVar399 + local_378) * (float)local_368._0_4_;
          local_368._4_4_ = (fVar282 * fVar401 + fStack_374) * (float)local_368._4_4_;
          fStack_360 = (fVar285 * fVar354 + fStack_370) * fStack_360;
          fStack_35c = (fVar317 * fVar404 + fStack_36c) * fStack_35c;
          fVar452 = fVar249 * fVar399 - (fVar443 * (float)local_368._0_4_ + local_508);
          fVar459 = fVar249 * fVar401 - (fVar448 * (float)local_368._4_4_ + fStack_504);
          fVar425 = fVar249 * fVar354 - (fVar450 * fStack_360 + fStack_500);
          fVar432 = fVar249 * fVar404 - (fVar451 * fStack_35c + fStack_4fc);
          auVar302._0_4_ = fVar250 * fVar399 - (fVar469 * (float)local_368._0_4_ + fVar473);
          auVar302._4_4_ = fVar250 * fVar401 - (fVar470 * (float)local_368._4_4_ + fVar478);
          auVar302._8_4_ = fVar250 * fVar354 - (fVar471 * fStack_360 + fVar479);
          auVar302._12_4_ = fVar250 * fVar404 - (fVar472 * fStack_35c + fVar480);
          bVar142 = 0.0 <= auVar342._0_4_;
          uVar144 = -(uint)bVar142;
          bVar32 = 0.0 <= auVar342._4_4_;
          uVar146 = -(uint)bVar32;
          bVar33 = 0.0 <= auVar342._8_4_;
          uVar148 = -(uint)bVar33;
          bVar34 = 0.0 <= auVar342._12_4_;
          uVar150 = -(uint)bVar34;
          fVar468 = fVar279 * fVar399 - ((float)local_368._0_4_ * fVar351 + fVar259);
          fVar259 = fVar279 * fVar401 - ((float)local_368._4_4_ * fVar353 + fVar280);
          fVar280 = fVar279 * fVar354 - (fStack_360 * fVar355 + fVar283);
          fVar282 = fVar279 * fVar404 - (fStack_35c * fVar367 + fVar286);
          auVar236._0_4_ = (uint)fVar349 & uVar144;
          auVar236._4_4_ = (uint)fVar379 & uVar146;
          auVar236._8_4_ = (uint)fVar368 & uVar148;
          auVar236._12_4_ = (uint)fVar370 & uVar150;
          auVar393._0_8_ = CONCAT44(~uVar146,~uVar144) & 0x7f8000007f800000;
          auVar393._8_4_ = ~uVar148 & 0x7f800000;
          auVar393._12_4_ = ~uVar150 & 0x7f800000;
          auVar393 = auVar393 | auVar236;
          auVar359._0_4_ = (uint)fVar399 & uVar144;
          auVar359._4_4_ = (uint)fVar401 & uVar146;
          auVar359._8_4_ = (uint)fVar354 & uVar148;
          auVar359._12_4_ = (uint)fVar404 & uVar150;
          auVar376._0_8_ = CONCAT44(~uVar146,~uVar144) & 0xff800000ff800000;
          auVar376._8_4_ = ~uVar148 & 0xff800000;
          auVar376._12_4_ = ~uVar150 & 0xff800000;
          auVar376 = auVar376 | auVar359;
          auVar83._4_4_ = fStack_334;
          auVar83._0_4_ = local_338;
          auVar83._8_4_ = fStack_330;
          auVar83._12_4_ = fStack_32c;
          auVar168 = maxps(auVar83,auVar458);
          fVar283 = auVar168._0_4_ * 1.9073486e-06;
          fVar285 = auVar168._4_4_ * 1.9073486e-06;
          fVar286 = auVar168._8_4_ * 1.9073486e-06;
          fVar317 = auVar168._12_4_ * 1.9073486e-06;
          auVar360._0_4_ = -(uint)(fVar436 < fVar283 && bVar142);
          auVar360._4_4_ = -(uint)(fVar439 < fVar285 && bVar32);
          auVar360._8_4_ = -(uint)(fVar462 < fVar286 && bVar33);
          auVar360._12_4_ = -(uint)(fVar465 < fVar317 && bVar34);
          iVar153 = movmskps(iVar153,auVar360);
          if (iVar153 != 0) {
            uVar144 = -(uint)(auVar254._0_4_ <= 0.0);
            uVar146 = -(uint)(auVar254._4_4_ <= 0.0);
            uVar148 = -(uint)(auVar254._8_4_ <= 0.0);
            uVar150 = -(uint)(auVar254._12_4_ <= 0.0);
            auVar411._0_4_ = (uVar144 & 0xff800000 | ~uVar144 & 0x7f800000) & auVar360._0_4_;
            auVar411._4_4_ = (uVar146 & 0xff800000 | ~uVar146 & 0x7f800000) & auVar360._4_4_;
            auVar411._8_4_ = (uVar148 & 0xff800000 | ~uVar148 & 0x7f800000) & auVar360._8_4_;
            auVar411._12_4_ = (uVar150 & 0xff800000 | ~uVar150 & 0x7f800000) & auVar360._12_4_;
            auVar419._0_4_ = ~auVar360._0_4_ & auVar393._0_4_;
            auVar419._4_4_ = ~auVar360._4_4_ & auVar393._4_4_;
            auVar419._8_4_ = ~auVar360._8_4_ & auVar393._8_4_;
            auVar419._12_4_ = ~auVar360._12_4_ & auVar393._12_4_;
            auVar393 = auVar419 | auVar411;
            auVar397._0_4_ = (uVar144 & 0x7f800000 | ~uVar144 & 0xff800000) & auVar360._0_4_;
            auVar397._4_4_ = (uVar146 & 0x7f800000 | ~uVar146 & 0xff800000) & auVar360._4_4_;
            auVar397._8_4_ = (uVar148 & 0x7f800000 | ~uVar148 & 0xff800000) & auVar360._8_4_;
            auVar397._12_4_ = (uVar150 & 0x7f800000 | ~uVar150 & 0xff800000) & auVar360._12_4_;
            auVar365._0_4_ = ~auVar360._0_4_ & auVar376._0_4_;
            auVar365._4_4_ = ~auVar360._4_4_ & auVar376._4_4_;
            auVar365._8_4_ = ~auVar360._8_4_ & auVar376._8_4_;
            auVar365._12_4_ = ~auVar360._12_4_ & auVar376._12_4_;
            auVar376 = auVar365 | auVar397;
            auVar270._4_4_ = -(uint)((fVar285 <= fVar439 || auVar254._4_4_ <= 0.0) && bVar32);
            auVar270._0_4_ = -(uint)((fVar283 <= fVar436 || auVar254._0_4_ <= 0.0) && bVar142);
            auVar270._8_4_ = -(uint)((fVar286 <= fVar462 || auVar254._8_4_ <= 0.0) && bVar33);
            auVar270._12_4_ = -(uint)((fVar317 <= fVar465 || auVar254._12_4_ <= 0.0) && bVar34);
          }
        }
        fVar436 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar439 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar462 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar168 = minps((undefined1  [16])aVar477,auVar393);
        aVar394 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar340,auVar376);
        tp1.lower.field_0 = aVar394;
        tp1.upper.field_0 = aVar477;
        auVar303._0_4_ = -(uint)(fVar431 <= auVar168._0_4_) & auVar187._0_4_;
        auVar303._4_4_ = -(uint)(fVar442 <= auVar168._4_4_) & auVar187._4_4_;
        auVar303._8_4_ = -(uint)(fVar447 <= auVar168._8_4_) & auVar187._8_4_;
        auVar303._12_4_ = -(uint)(fVar449 <= auVar168._12_4_) & auVar187._12_4_;
        local_368 = (undefined1  [8])
                    CONCAT44(-(uint)(aVar394.v[1] <= aVar477.v[1]) & auVar187._4_4_,
                             -(uint)(aVar394.v[0] <= aVar477.v[0]) & auVar187._0_4_);
        fStack_360 = (float)(-(uint)(aVar394.v[2] <= aVar477.v[2]) & auVar187._8_4_);
        fStack_35c = (float)(-(uint)(aVar394.v[3] <= aVar477.v[3]) & auVar187._12_4_);
        auVar188._8_4_ = fStack_360;
        auVar188._0_8_ = local_368;
        auVar188._12_4_ = fStack_35c;
        iVar153 = movmskps(iVar153,auVar188 | auVar303);
        pRVar132 = (RTCRayN *)CONCAT44((int)((ulong)pSVar131 >> 0x20),iVar153);
        if (iVar153 != 0) {
          local_378 = local_60c;
          fStack_374 = local_60c;
          fStack_370 = local_60c;
          fStack_36c = local_60c;
          local_518._0_4_ =
               -(uint)((int)local_60c <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_518._0_4_ * fVar462 +
                                                            (float)local_5a8._0_4_ * fVar439 +
                                                           (float)local_598._0_4_ * fVar436) &
                                                    uVar147)) & auVar270._0_4_) << 0x1f) >> 0x1f) +
                      4);
          local_518._4_4_ =
               -(uint)((int)local_60c <
                      ((int)((-(uint)(0.3 <= (float)((uint)((float)local_518._4_4_ * fVar462 +
                                                            (float)local_5a8._4_4_ * fVar439 +
                                                           (float)local_598._4_4_ * fVar436) &
                                                    uVar149)) & auVar270._4_4_) << 0x1f) >> 0x1f) +
                      4);
          fStack_510 = (float)-(uint)((int)local_60c <
                                     ((int)((-(uint)(0.3 <= (float)((uint)(fStack_510 * fVar462 +
                                                                           fStack_5a0 * fVar439 +
                                                                          fStack_590 * fVar436) &
                                                                   uVar369)) & auVar270._8_4_) <<
                                           0x1f) >> 0x1f) + 4);
          fStack_50c = (float)-(uint)((int)local_60c <
                                     ((int)((-(uint)(0.3 <= (float)((uint)(fStack_50c * fVar462 +
                                                                           fStack_59c * fVar439 +
                                                                          fStack_58c * fVar436) &
                                                                   uVar371)) & auVar270._12_4_) <<
                                           0x1f) >> 0x1f) + 4);
          auVar189 = ~_local_518 & auVar303;
          auVar168 = _DAT_01f46710;
          fVar465 = uStack_4f4;
          while( true ) {
            vVar128.field_0 = tp1.lower.field_0;
            uStack_4f4._2_2_ = (undefined2)((uint)fVar465 >> 0x10);
            uStack_4f4._0_2_ = SUB42(fVar465,0);
            local_268 = auVar189;
            uVar134 = (undefined4)((ulong)pRVar132 >> 0x20);
            iVar153 = movmskps((int)pRVar132,auVar189);
            pRVar132 = (RTCRayN *)CONCAT44(uVar134,iVar153);
            if (iVar153 == 0) break;
            uVar144 = auVar189._0_4_;
            uVar146 = auVar189._4_4_;
            uVar148 = auVar189._8_4_;
            uVar150 = auVar189._12_4_;
            auVar237._0_4_ = uVar144 & (uint)fVar431;
            auVar237._4_4_ = uVar146 & (uint)fVar442;
            auVar237._8_4_ = uVar148 & (uint)fVar447;
            auVar237._12_4_ = uVar150 & (uint)fVar449;
            auVar255._0_8_ = CONCAT44(~uVar146,~uVar144) & 0x7f8000007f800000;
            auVar255._8_4_ = ~uVar148 & 0x7f800000;
            auVar255._12_4_ = ~uVar150 & 0x7f800000;
            auVar255 = auVar255 | auVar237;
            auVar271._4_4_ = auVar255._0_4_;
            auVar271._0_4_ = auVar255._4_4_;
            auVar271._8_4_ = auVar255._12_4_;
            auVar271._12_4_ = auVar255._8_4_;
            auVar262 = minps(auVar271,auVar255);
            auVar238._0_8_ = auVar262._8_8_;
            auVar238._8_4_ = auVar262._0_4_;
            auVar238._12_4_ = auVar262._4_4_;
            auVar262 = minps(auVar238,auVar262);
            auVar239._0_8_ =
                 CONCAT44(-(uint)(auVar262._4_4_ == auVar255._4_4_) & uVar146,
                          -(uint)(auVar262._0_4_ == auVar255._0_4_) & uVar144);
            auVar239._8_4_ = -(uint)(auVar262._8_4_ == auVar255._8_4_) & uVar148;
            auVar239._12_4_ = -(uint)(auVar262._12_4_ == auVar255._12_4_) & uVar150;
            iVar153 = movmskps(iVar153,auVar239);
            if (iVar153 != 0) {
              auVar189._8_4_ = auVar239._8_4_;
              auVar189._0_8_ = auVar239._0_8_;
              auVar189._12_4_ = auVar239._12_4_;
            }
            uVar129 = movmskps(iVar153,auVar189);
            uVar133 = CONCAT44(uVar134,uVar129);
            pRVar132 = (RTCRayN *)0x0;
            if (uVar133 != 0) {
              for (; (uVar133 >> (long)pRVar132 & 1) == 0; pRVar132 = pRVar132 + 1) {
              }
            }
            *(undefined4 *)(local_268 + (long)pRVar132 * 4) = 0;
            fVar283 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar285 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar286 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar317 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar75._4_2_ = uStack_584;
            auVar75._0_4_ = fVar316;
            auVar75._6_2_ = uStack_582;
            auVar75._8_4_ = fVar350;
            auVar75._12_4_ = fVar313;
            auVar77._4_2_ = (undefined2)uStack_4f4;
            auVar77._0_4_ = local_4f8;
            auVar77._6_2_ = uStack_4f4._2_2_;
            auVar77._8_4_ = fStack_4f0;
            auVar77._12_4_ = fStack_4ec;
            auVar340 = minps(auVar75,auVar77);
            auVar373 = maxps(auVar75,auVar77);
            auVar80._4_4_ = fVar398;
            auVar80._0_4_ = fVar378;
            auVar80._8_4_ = fVar412;
            auVar80._12_4_ = fVar420;
            auVar262 = minps(auVar80,_local_5f8);
            auVar340 = minps(auVar340,auVar262);
            auVar262 = maxps(auVar80,_local_5f8);
            auVar373 = maxps(auVar373,auVar262);
            auVar304._0_4_ = auVar340._0_4_ & auVar168._0_4_;
            auVar304._4_4_ = auVar340._4_4_ & auVar168._4_4_;
            auVar304._8_4_ = auVar340._8_4_ & auVar168._8_4_;
            auVar304._12_4_ = auVar340._12_4_ & auVar168._12_4_;
            auVar190._0_4_ = auVar373._0_4_ & auVar168._0_4_;
            auVar190._4_4_ = auVar373._4_4_ & auVar168._4_4_;
            auVar190._8_4_ = auVar373._8_4_ & auVar168._8_4_;
            auVar190._12_4_ = (uint)auVar373._12_4_ & auVar168._12_4_;
            auVar262 = maxps(auVar304,auVar190);
            fVar349 = auVar262._4_4_;
            if (auVar262._4_4_ <= auVar262._0_4_) {
              fVar349 = auVar262._0_4_;
            }
            auVar305._8_8_ = auVar262._8_8_;
            auVar305._0_8_ = auVar262._8_8_;
            if (auVar262._8_4_ <= fVar349) {
              auVar305._0_4_ = fVar349;
            }
            fVar353 = auVar305._0_4_ * 1.9073486e-06;
            fVar349 = local_108[(long)pRVar132];
            fVar351 = local_118[(long)(pRVar132 + -8)];
            fVar355 = 0.0;
            fVar367 = 0.0;
            lVar140 = 5;
            do {
              bVar142 = lVar140 == 0;
              lVar140 = lVar140 + -1;
              if (bVar142) goto LAB_00376e8c;
              fVar368 = SQRT(fVar286 * fVar286 + fVar285 * fVar285 + fVar283 * fVar283) *
                        1.9073486e-06 * fVar351;
              fVar379 = 1.0 - fVar349;
              fVar354 = fVar349 * fVar379;
              fVar370 = fVar379 * fVar379 * fVar379;
              fVar413 = fVar349 * fVar349 * fVar349;
              fVar399 = fVar370 * 0.16666667;
              fVar407 = (fVar379 * fVar354 * 12.0 + fVar354 * fVar349 * 6.0 +
                        fVar370 * 4.0 + fVar413) * 0.16666667;
              fVar414 = (fVar354 * fVar349 * 12.0 + fVar379 * fVar354 * 6.0 +
                        fVar413 * 4.0 + fVar370) * 0.16666667;
              fVar413 = fVar413 * 0.16666667;
              fVar401 = fVar399 * fVar313 +
                        fVar407 * fStack_4ec + fVar414 * fVar420 + fVar413 * fStack_5ec;
              fVar415 = -fVar379 * fVar379 * 0.5;
              fVar404 = (-fVar349 * fVar349 - fVar354 * 4.0) * 0.5;
              fVar354 = (fVar379 * fVar379 + fVar354 * 4.0) * 0.5;
              fVar370 = fVar349 * fVar349 * 0.5;
              fVar400 = fVar415 * fVar316 +
                        fVar404 * local_4f8 + fVar354 * fVar378 + fVar370 * (float)local_5f8._0_4_;
              fVar402 = fVar415 * fVar348 +
                        fVar404 * fVar465 + fVar354 * fVar398 + fVar370 * (float)local_5f8._4_4_;
              fVar405 = fVar415 * fVar350 +
                        fVar404 * fStack_4f0 + fVar354 * fVar412 + fVar370 * fStack_5f0;
              fVar415 = fVar415 * fVar313 +
                        fVar404 * fStack_4ec + fVar354 * fVar420 + fVar370 * fStack_5ec;
              fVar354 = fVar349 - (fVar379 + fVar379);
              fVar370 = fVar379 - (fVar349 + fVar349);
              fVar416 = fVar379 * fVar316 +
                        fVar354 * local_4f8 + fVar370 * fVar378 + (float)local_5f8._0_4_ * fVar349;
              fVar421 = fVar379 * fVar348 +
                        fVar354 * fVar465 + fVar370 * fVar398 + (float)local_5f8._4_4_ * fVar349;
              fVar422 = fVar379 * fVar350 +
                        fVar354 * fStack_4f0 + fVar370 * fVar412 + fStack_5f0 * fVar349;
              fVar354 = (fVar351 * fVar283 + 0.0) -
                        (fVar399 * fVar316 +
                        fVar407 * local_4f8 + fVar414 * fVar378 + fVar413 * (float)local_5f8._0_4_);
              fVar404 = (fVar351 * fVar285 + 0.0) -
                        (fVar399 * fVar348 +
                        fVar407 * fVar465 + fVar414 * fVar398 + fVar413 * (float)local_5f8._4_4_);
              fVar407 = (fVar351 * fVar286 + 0.0) -
                        (fVar399 * fVar350 +
                        fVar407 * fStack_4f0 + fVar414 * fVar412 + fVar413 * fStack_5f0);
              fVar413 = (fVar351 * fVar317 + 0.0) - fVar401;
              fVar379 = fVar404 * fVar404;
              fVar370 = fVar407 * fVar407;
              fVar399 = fVar413 * fVar413;
              auVar395._0_4_ = fVar379 + fVar354 * fVar354 + fVar370;
              auVar395._4_4_ = fVar379 + fVar379 + fVar399;
              auVar395._8_4_ = fVar379 + fVar370 + fVar370;
              auVar395._12_4_ = fVar379 + fVar399 + fVar399;
              fVar379 = fVar353;
              if (fVar353 <= fVar368) {
                fVar379 = fVar368;
              }
              fVar370 = fVar402 * fVar402 + fVar400 * fVar400 + fVar405 * fVar405;
              auVar262 = ZEXT416((uint)fVar370);
              auVar168 = rsqrtss(ZEXT416((uint)fVar370),auVar262);
              fVar368 = auVar168._0_4_;
              fVar399 = fVar368 * 1.5 - fVar368 * fVar368 * fVar370 * 0.5 * fVar368;
              fVar427 = fVar400 * fVar399;
              fVar433 = fVar402 * fVar399;
              fVar434 = fVar405 * fVar399;
              fVar437 = fVar415 * fVar399;
              fVar441 = fVar422 * fVar405 + fVar421 * fVar402 + fVar416 * fVar400;
              auVar168 = rcpss(auVar262,auVar262);
              fVar368 = (2.0 - fVar370 * auVar168._0_4_) * auVar168._0_4_;
              fVar414 = fVar404 * fVar433;
              fVar423 = fVar407 * fVar434;
              fVar426 = fVar413 * fVar437;
              fVar438 = fVar414 + fVar354 * fVar427 + fVar423;
              fVar440 = fVar414 + fVar414 + fVar426;
              fVar423 = fVar414 + fVar423 + fVar423;
              fVar426 = fVar414 + fVar426 + fVar426;
              fVar443 = (SQRT(auVar395._0_4_) + 1.0) * (fVar353 / SQRT(fVar370)) +
                        SQRT(auVar395._0_4_) * fVar353 + fVar379;
              fVar414 = fVar437 * -fVar415;
              fVar399 = fVar434 * -fVar405 + fVar433 * -fVar402 + fVar427 * -fVar400 +
                        fVar368 * (fVar370 * fVar422 - fVar441 * fVar405) * fVar399 * fVar407 +
                        fVar368 * (fVar370 * fVar421 - fVar441 * fVar402) * fVar399 * fVar404 +
                        fVar368 * (fVar370 * fVar416 - fVar441 * fVar400) * fVar399 * fVar354;
              fVar416 = fVar286 * fVar434 + fVar285 * fVar433 + fVar283 * fVar427;
              fVar368 = auVar395._0_4_ - fVar438 * fVar438;
              auVar191._0_8_ = CONCAT44(auVar395._4_4_ - fVar440 * fVar440,fVar368);
              auVar191._8_4_ = auVar395._8_4_ - fVar423 * fVar423;
              auVar191._12_4_ = auVar395._12_4_ - fVar426 * fVar426;
              fVar421 = -fVar415 * fVar413;
              local_5b8 = CONCAT44(fVar414,fVar399);
              auVar240._8_4_ = auVar191._8_4_;
              auVar240._0_8_ = auVar191._0_8_;
              auVar240._12_4_ = auVar191._12_4_;
              auVar168 = rsqrtss(auVar240,auVar191);
              fVar370 = auVar168._0_4_;
              fVar370 = fVar370 * 1.5 - fVar370 * fVar370 * fVar368 * 0.5 * fVar370;
              local_508 = fVar351;
              fStack_504 = fVar349;
              fStack_500 = fVar355;
              fStack_4fc = fVar367;
              if (fVar368 < 0.0) {
                uStack_4f4 = fVar465;
                fVar368 = sqrtf(fVar368);
                pRVar132 = extraout_RAX;
                pRVar137 = extraout_RDX;
                fVar465 = uStack_4f4;
              }
              else {
                fVar368 = SQRT(fVar368);
              }
              auVar168 = _DAT_01f46710;
              fVar368 = fVar368 - fVar401;
              fVar349 = ((-fVar405 * fVar407 + -fVar402 * fVar404 + -fVar400 * fVar354) -
                        fVar438 * fVar399) * fVar370 - fVar415;
              fVar370 = ((fVar286 * fVar407 + fVar285 * fVar404 + fVar283 * fVar354) -
                        fVar438 * fVar416) * fVar370;
              auVar307._0_8_ = CONCAT44(fVar421,fVar349) ^ 0x8000000080000000;
              auVar272._0_4_ = fVar399 * fVar370 - fVar416 * fVar349;
              auVar307._8_4_ = -fVar421;
              auVar307._12_4_ = fVar317 * fVar413;
              auVar306._8_8_ = auVar307._8_8_;
              auVar306._0_8_ = CONCAT44(fVar370,fVar349) ^ 0x80000000;
              auVar272._4_4_ = auVar272._0_4_;
              auVar272._8_4_ = auVar272._0_4_;
              auVar272._12_4_ = auVar272._0_4_;
              auVar262 = divps(auVar306,auVar272);
              auVar362._8_4_ = fVar414;
              auVar362._0_8_ = local_5b8;
              auVar362._12_4_ = -(fVar317 * fVar437);
              auVar361._8_8_ = auVar362._8_8_;
              auVar361._0_8_ = CONCAT44(fVar416,fVar399) ^ 0x8000000000000000;
              auVar340 = divps(auVar361,auVar272);
              fVar351 = local_508 - (fVar368 * auVar340._0_4_ + fVar438 * auVar262._0_4_);
              fVar349 = fStack_504 - (fVar368 * auVar340._4_4_ + fVar438 * auVar262._4_4_);
              fVar355 = fStack_500 - (fVar368 * auVar340._8_4_ + fVar438 * auVar262._8_4_);
              fVar367 = fStack_4fc - (fVar368 * auVar340._12_4_ + fVar438 * auVar262._12_4_);
            } while ((fVar443 <= (float)((uint)fVar438 & (uint)DAT_01f46710)) ||
                    (auVar373._12_4_ * 1.9073486e-06 + fVar379 + fVar443 <=
                     (float)((uint)fVar368 & (uint)DAT_01f46710)));
            fVar351 = local_358._0_4_ + fVar351;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar351) &&
               (((fVar283 = (ray->super_RayK<1>).tfar, fVar351 <= fVar283 && (0.0 <= fVar349)) &&
                (fVar349 <= 1.0)))) {
              auVar262 = rsqrtss(auVar395,auVar395);
              fVar285 = auVar262._0_4_;
              pGVar29 = (context->scene->geometries).items[uVar143].ptr;
              uVar144 = (ray->super_RayK<1>).mask;
              pRVar132 = (RTCRayN *)(ulong)uVar144;
              if ((pGVar29->mask & uVar144) != 0) {
                fVar285 = fVar285 * 1.5 + fVar285 * fVar285 * auVar395._0_4_ * -0.5 * fVar285;
                fVar354 = fVar354 * fVar285;
                fVar404 = fVar404 * fVar285;
                fVar407 = fVar407 * fVar285;
                fVar285 = fVar415 * fVar354 + fVar400;
                fVar286 = fVar415 * fVar404 + fVar402;
                fVar317 = fVar415 * fVar407 + fVar405;
                fVar355 = fVar404 * fVar400 - fVar402 * fVar354;
                fVar367 = fVar407 * fVar402 - fVar405 * fVar404;
                fVar379 = fVar354 * fVar405 - fVar400 * fVar407;
                fVar353 = fVar286 * fVar367 - fVar379 * fVar285;
                uVar210 = CONCAT44(fVar285 * fVar355 - fVar367 * fVar317,
                                   fVar317 * fVar379 - fVar355 * fVar286);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar351;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar210;
                  (ray->Ng).field_0.field_0.z = fVar353;
                  ray->u = fVar349;
                  ray->v = 0.0;
                  ray->primID = uVar145;
                  ray->geomID = uVar143;
                  ray->instID[0] = context->user->instID[0];
                  uVar144 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar144;
                  pRVar132 = (RTCRayN *)(ulong)uVar144;
                }
                else {
                  vu0.field_0._0_8_ = uVar210;
                  vu0.field_0.v[2] = fVar353;
                  vu0.field_0.v[3] = fVar349;
                  pRVar135 = (RTCIntersectArguments *)(ulong)context->user->instID[0];
                  (ray->super_RayK<1>).tfar = fVar351;
                  local_388._0_4_ = 0xffffffff;
                  args.geometryUserPtr = pGVar29->userPtr;
                  args.valid = (int *)local_388;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  uStack_4f4 = fVar465;
                  if (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00376fa2:
                    pRVar135 = context->args;
                    fVar465 = uStack_4f4;
                    if ((pRVar135->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar135->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar135->filter)(&args);
                      pRVar137 = extraout_RDX_01;
                      auVar168 = _DAT_01f46710;
                      fVar465 = uStack_4f4;
                      if (*args.valid == 0) goto LAB_0037703d;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    pRVar137 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    pRVar135 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                    *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                    pRVar132 = args.ray;
                  }
                  else {
                    (*pGVar29->intersectionFilterN)(&args);
                    pRVar137 = extraout_RDX_00;
                    auVar168 = _DAT_01f46710;
                    fVar465 = uStack_4f4;
                    if (*args.valid != 0) goto LAB_00376fa2;
LAB_0037703d:
                    auVar168 = _DAT_01f46710;
                    (ray->super_RayK<1>).tfar = fVar283;
                    pRVar132 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_00376e8c:
            fVar283 = (ray->super_RayK<1>).tfar;
            auVar189._0_4_ = -(uint)(fVar288 + fVar431 <= fVar283) & local_268._0_4_;
            auVar189._4_4_ = -(uint)(fVar288 + fVar442 <= fVar283) & local_268._4_4_;
            auVar189._8_4_ = -(uint)(fVar288 + fVar447 <= fVar283) & local_268._8_4_;
            auVar189._12_4_ = -(uint)(fVar288 + fVar449 <= fVar283) & local_268._12_4_;
          }
          fVar283 = (ray->super_RayK<1>).tfar;
          auVar273._0_4_ = -(uint)(aVar394.v[0] + fVar288 <= fVar283) & local_368._0_4_;
          auVar273._4_4_ = -(uint)(aVar394.v[1] + fVar288 <= fVar283) & local_368._4_4_;
          auVar273._8_4_ = -(uint)(aVar394.v[2] + fVar288 <= fVar283) & (uint)fStack_360;
          auVar273._12_4_ = -(uint)(aVar394.v[3] + fVar288 <= fVar283) & (uint)fStack_35c;
          auVar241._0_4_ =
               -(uint)((int)local_378 <
                      ((int)((-(uint)(0.3 <= (float)((uint)(fVar452 * fVar436 +
                                                           auVar302._0_4_ * fVar439 +
                                                           fVar468 * fVar462) & uVar147)) &
                             auVar270._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar241._4_4_ =
               -(uint)((int)fStack_374 <
                      ((int)((-(uint)(0.3 <= (float)((uint)(fVar459 * fVar436 +
                                                           auVar302._4_4_ * fVar439 +
                                                           fVar259 * fVar462) & uVar149)) &
                             auVar270._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar241._8_4_ =
               -(uint)((int)fStack_370 <
                      ((int)((-(uint)(0.3 <= (float)((uint)(fVar425 * fVar436 +
                                                           auVar302._8_4_ * fVar439 +
                                                           fVar280 * fVar462) & uVar369)) &
                             auVar270._8_4_) << 0x1f) >> 0x1f) + 4);
          auVar241._12_4_ =
               -(uint)((int)fStack_36c <
                      ((int)((-(uint)(0.3 <= (float)((uint)(fVar432 * fVar436 +
                                                           auVar302._12_4_ * fVar439 +
                                                           fVar282 * fVar462) & uVar371)) &
                             auVar270._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar242 = ~auVar241 & auVar273;
          fVar452 = fVar288 + tp1.lower.field_0.v[0];
          fVar459 = fVar288 + tp1.lower.field_0.v[1];
          fVar425 = fVar288 + tp1.lower.field_0.v[2];
          fVar432 = fVar288 + tp1.lower.field_0.v[3];
          while( true ) {
            uStack_4f4._2_2_ = (undefined2)((uint)fVar465 >> 0x10);
            uStack_4f4._0_2_ = SUB42(fVar465,0);
            local_388 = auVar242;
            iVar153 = movmskps((int)pRVar132,auVar242);
            if (iVar153 == 0) break;
            auVar340 = ~auVar242 & _DAT_01f45a30 | auVar242 & (undefined1  [16])vVar128.field_0;
            auVar274._4_4_ = auVar340._0_4_;
            auVar274._0_4_ = auVar340._4_4_;
            auVar274._8_4_ = auVar340._12_4_;
            auVar274._12_4_ = auVar340._8_4_;
            auVar262 = minps(auVar274,auVar340);
            auVar192._0_8_ = auVar262._8_8_;
            auVar192._8_4_ = auVar262._0_4_;
            auVar192._12_4_ = auVar262._4_4_;
            auVar262 = minps(auVar192,auVar262);
            auVar193._0_8_ =
                 CONCAT44(-(uint)(auVar262._4_4_ == auVar340._4_4_) & auVar242._4_4_,
                          -(uint)(auVar262._0_4_ == auVar340._0_4_) & auVar242._0_4_);
            auVar193._8_4_ = -(uint)(auVar262._8_4_ == auVar340._8_4_) & auVar242._8_4_;
            auVar193._12_4_ = -(uint)(auVar262._12_4_ == auVar340._12_4_) & auVar242._12_4_;
            iVar153 = movmskps(iVar153,auVar193);
            if (iVar153 != 0) {
              auVar242._8_4_ = auVar193._8_4_;
              auVar242._0_8_ = auVar193._0_8_;
              auVar242._12_4_ = auVar193._12_4_;
            }
            uVar134 = movmskps(iVar153,auVar242);
            uVar133 = CONCAT44((int)((ulong)pRVar132 >> 0x20),uVar134);
            pRVar132 = (RTCRayN *)0x0;
            if (uVar133 != 0) {
              for (; (uVar133 >> (long)pRVar132 & 1) == 0; pRVar132 = pRVar132 + 1) {
              }
            }
            *(undefined4 *)(local_388 + (long)pRVar132 * 4) = 0;
            fVar436 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar439 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar462 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar468 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar76._4_2_ = uStack_584;
            auVar76._0_4_ = fVar316;
            auVar76._6_2_ = uStack_582;
            auVar76._8_4_ = fVar350;
            auVar76._12_4_ = fVar313;
            auVar78._4_2_ = (undefined2)uStack_4f4;
            auVar78._0_4_ = local_4f8;
            auVar78._6_2_ = uStack_4f4._2_2_;
            auVar78._8_4_ = fStack_4f0;
            auVar78._12_4_ = fStack_4ec;
            auVar340 = minps(auVar76,auVar78);
            auVar373 = maxps(auVar76,auVar78);
            auVar81._4_4_ = fVar398;
            auVar81._0_4_ = fVar378;
            auVar81._8_4_ = fVar412;
            auVar81._12_4_ = fVar420;
            auVar262 = minps(auVar81,_local_5f8);
            auVar340 = minps(auVar340,auVar262);
            auVar262 = maxps(auVar81,_local_5f8);
            auVar373 = maxps(auVar373,auVar262);
            auVar308._0_4_ = auVar340._0_4_ & auVar168._0_4_;
            auVar308._4_4_ = auVar340._4_4_ & auVar168._4_4_;
            auVar308._8_4_ = auVar340._8_4_ & auVar168._8_4_;
            auVar308._12_4_ = auVar340._12_4_ & auVar168._12_4_;
            auVar194._0_4_ = auVar373._0_4_ & auVar168._0_4_;
            auVar194._4_4_ = auVar373._4_4_ & auVar168._4_4_;
            auVar194._8_4_ = auVar373._8_4_ & auVar168._8_4_;
            auVar194._12_4_ = (uint)auVar373._12_4_ & auVar168._12_4_;
            auVar262 = maxps(auVar308,auVar194);
            fVar259 = auVar262._4_4_;
            if (auVar262._4_4_ <= auVar262._0_4_) {
              fVar259 = auVar262._0_4_;
            }
            auVar309._8_8_ = auVar262._8_8_;
            auVar309._0_8_ = auVar262._8_8_;
            if (auVar262._8_4_ <= fVar259) {
              auVar309._0_4_ = fVar259;
            }
            fVar282 = auVar309._0_4_ * 1.9073486e-06;
            fVar259 = local_108[(long)(pRVar132 + -4)];
            fVar280 = tp1.upper.field_0.v[(long)pRVar132];
            fVar283 = 0.0;
            fVar285 = 0.0;
            lVar140 = 5;
            do {
              bVar142 = lVar140 == 0;
              lVar140 = lVar140 + -1;
              if (bVar142) goto LAB_003778f0;
              fVar317 = SQRT(fVar462 * fVar462 + fVar439 * fVar439 + fVar436 * fVar436) *
                        1.9073486e-06 * fVar280;
              fVar286 = 1.0 - fVar259;
              fVar355 = fVar259 * fVar286;
              fVar349 = fVar286 * fVar286 * fVar286;
              fVar368 = fVar259 * fVar259 * fVar259;
              fVar351 = fVar349 * 0.16666667;
              fVar379 = (fVar286 * fVar355 * 12.0 + fVar355 * fVar259 * 6.0 +
                        fVar349 * 4.0 + fVar368) * 0.16666667;
              fVar370 = (fVar355 * fVar259 * 12.0 + fVar286 * fVar355 * 6.0 +
                        fVar368 * 4.0 + fVar349) * 0.16666667;
              fVar368 = fVar368 * 0.16666667;
              fVar353 = fVar351 * fVar313 +
                        fVar379 * fStack_4ec + fVar370 * fVar420 + fVar368 * fStack_5ec;
              fVar399 = -fVar286 * fVar286 * 0.5;
              fVar367 = (-fVar259 * fVar259 - fVar355 * 4.0) * 0.5;
              fVar355 = (fVar286 * fVar286 + fVar355 * 4.0) * 0.5;
              fVar349 = fVar259 * fVar259 * 0.5;
              fVar401 = fVar399 * fVar316 +
                        fVar367 * local_4f8 + fVar355 * fVar378 + fVar349 * (float)local_5f8._0_4_;
              fVar354 = fVar399 * fVar348 +
                        fVar367 * fVar465 + fVar355 * fVar398 + fVar349 * (float)local_5f8._4_4_;
              fVar404 = fVar399 * fVar350 +
                        fVar367 * fStack_4f0 + fVar355 * fVar412 + fVar349 * fStack_5f0;
              fVar399 = fVar399 * fVar313 +
                        fVar367 * fStack_4ec + fVar355 * fVar420 + fVar349 * fStack_5ec;
              fVar355 = fVar259 - (fVar286 + fVar286);
              fVar349 = fVar286 - (fVar259 + fVar259);
              fVar407 = fVar286 * fVar316 +
                        fVar355 * local_4f8 + fVar349 * fVar378 + (float)local_5f8._0_4_ * fVar259;
              fVar413 = fVar286 * fVar348 +
                        fVar355 * fVar465 + fVar349 * fVar398 + (float)local_5f8._4_4_ * fVar259;
              fVar414 = fVar286 * fVar350 +
                        fVar355 * fStack_4f0 + fVar349 * fVar412 + fStack_5f0 * fVar259;
              fVar355 = (fVar280 * fVar436 + 0.0) -
                        (fVar351 * fVar316 +
                        fVar379 * local_4f8 + fVar370 * fVar378 + fVar368 * (float)local_5f8._0_4_);
              fVar367 = (fVar280 * fVar439 + 0.0) -
                        (fVar351 * fVar348 +
                        fVar379 * fVar465 + fVar370 * fVar398 + fVar368 * (float)local_5f8._4_4_);
              fVar379 = (fVar280 * fVar462 + 0.0) -
                        (fVar351 * fVar350 +
                        fVar379 * fStack_4f0 + fVar370 * fVar412 + fVar368 * fStack_5f0);
              fVar368 = (fVar280 * fVar468 + 0.0) - fVar353;
              fVar286 = fVar367 * fVar367;
              fVar349 = fVar379 * fVar379;
              fVar351 = fVar368 * fVar368;
              auVar396._0_4_ = fVar286 + fVar355 * fVar355 + fVar349;
              auVar396._4_4_ = fVar286 + fVar286 + fVar351;
              auVar396._8_4_ = fVar286 + fVar349 + fVar349;
              auVar396._12_4_ = fVar286 + fVar351 + fVar351;
              fVar286 = fVar282;
              if (fVar282 <= fVar317) {
                fVar286 = fVar317;
              }
              fVar349 = fVar354 * fVar354 + fVar401 * fVar401 + fVar404 * fVar404;
              auVar262 = ZEXT416((uint)fVar349);
              auVar168 = rsqrtss(ZEXT416((uint)fVar349),auVar262);
              fVar317 = auVar168._0_4_;
              fVar351 = fVar317 * 1.5 - fVar317 * fVar317 * fVar349 * 0.5 * fVar317;
              fVar402 = fVar401 * fVar351;
              fVar405 = fVar354 * fVar351;
              fVar416 = fVar404 * fVar351;
              fVar421 = fVar399 * fVar351;
              fVar426 = fVar414 * fVar404 + fVar413 * fVar354 + fVar407 * fVar401;
              auVar168 = rcpss(auVar262,auVar262);
              fVar317 = (2.0 - fVar349 * auVar168._0_4_) * auVar168._0_4_;
              fVar370 = fVar367 * fVar405;
              fVar415 = fVar379 * fVar416;
              fVar400 = fVar368 * fVar421;
              fVar422 = fVar370 + fVar355 * fVar402 + fVar415;
              fVar423 = fVar370 + fVar370 + fVar400;
              fVar415 = fVar370 + fVar415 + fVar415;
              fVar400 = fVar370 + fVar400 + fVar400;
              fVar427 = (SQRT(auVar396._0_4_) + 1.0) * (fVar282 / SQRT(fVar349)) +
                        SQRT(auVar396._0_4_) * fVar282 + fVar286;
              fVar370 = fVar421 * -fVar399;
              fVar351 = fVar416 * -fVar404 + fVar405 * -fVar354 + fVar402 * -fVar401 +
                        fVar317 * (fVar349 * fVar414 - fVar426 * fVar404) * fVar351 * fVar379 +
                        fVar317 * (fVar349 * fVar413 - fVar426 * fVar354) * fVar351 * fVar367 +
                        fVar317 * (fVar349 * fVar407 - fVar426 * fVar401) * fVar351 * fVar355;
              fVar407 = fVar462 * fVar416 + fVar439 * fVar405 + fVar436 * fVar402;
              fVar317 = auVar396._0_4_ - fVar422 * fVar422;
              auVar195._0_8_ = CONCAT44(auVar396._4_4_ - fVar423 * fVar423,fVar317);
              auVar195._8_4_ = auVar396._8_4_ - fVar415 * fVar415;
              auVar195._12_4_ = auVar396._12_4_ - fVar400 * fVar400;
              fVar413 = -fVar399 * fVar368;
              local_5b8 = CONCAT44(fVar370,fVar351);
              auVar243._8_4_ = auVar195._8_4_;
              auVar243._0_8_ = auVar195._0_8_;
              auVar243._12_4_ = auVar195._12_4_;
              auVar168 = rsqrtss(auVar243,auVar195);
              fVar349 = auVar168._0_4_;
              fVar349 = fVar349 * 1.5 - fVar349 * fVar349 * fVar317 * 0.5 * fVar349;
              local_508 = fVar280;
              fStack_504 = fVar259;
              fStack_500 = fVar283;
              fStack_4fc = fVar285;
              if (fVar317 < 0.0) {
                uStack_4f4 = fVar465;
                fVar317 = sqrtf(fVar317);
                pRVar132 = extraout_RAX_00;
                pRVar137 = extraout_RDX_02;
                fVar465 = uStack_4f4;
              }
              else {
                fVar317 = SQRT(fVar317);
              }
              auVar168 = _DAT_01f46710;
              fVar317 = fVar317 - fVar353;
              fVar259 = ((-fVar404 * fVar379 + -fVar354 * fVar367 + -fVar401 * fVar355) -
                        fVar422 * fVar351) * fVar349 - fVar399;
              fVar349 = ((fVar462 * fVar379 + fVar439 * fVar367 + fVar436 * fVar355) -
                        fVar422 * fVar407) * fVar349;
              auVar311._0_8_ = CONCAT44(fVar413,fVar259) ^ 0x8000000080000000;
              auVar275._0_4_ = fVar351 * fVar349 - fVar407 * fVar259;
              auVar311._8_4_ = -fVar413;
              auVar311._12_4_ = fVar468 * fVar368;
              auVar310._8_8_ = auVar311._8_8_;
              auVar310._0_8_ = CONCAT44(fVar349,fVar259) ^ 0x80000000;
              auVar275._4_4_ = auVar275._0_4_;
              auVar275._8_4_ = auVar275._0_4_;
              auVar275._12_4_ = auVar275._0_4_;
              auVar262 = divps(auVar310,auVar275);
              auVar364._8_4_ = fVar370;
              auVar364._0_8_ = local_5b8;
              auVar364._12_4_ = -(fVar468 * fVar421);
              auVar363._8_8_ = auVar364._8_8_;
              auVar363._0_8_ = CONCAT44(fVar407,fVar351) ^ 0x8000000000000000;
              auVar340 = divps(auVar363,auVar275);
              fVar280 = local_508 - (fVar317 * auVar340._0_4_ + fVar422 * auVar262._0_4_);
              fVar259 = fStack_504 - (fVar317 * auVar340._4_4_ + fVar422 * auVar262._4_4_);
              fVar283 = fStack_500 - (fVar317 * auVar340._8_4_ + fVar422 * auVar262._8_4_);
              fVar285 = fStack_4fc - (fVar317 * auVar340._12_4_ + fVar422 * auVar262._12_4_);
            } while ((fVar427 <= (float)((uint)fVar422 & (uint)DAT_01f46710)) ||
                    (auVar373._12_4_ * 1.9073486e-06 + fVar286 + fVar427 <=
                     (float)((uint)fVar317 & (uint)DAT_01f46710)));
            fVar280 = local_358._0_4_ + fVar280;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar280) &&
               (((fVar436 = (ray->super_RayK<1>).tfar, fVar280 <= fVar436 && (0.0 <= fVar259)) &&
                (fVar259 <= 1.0)))) {
              auVar262 = rsqrtss(auVar396,auVar396);
              fVar439 = auVar262._0_4_;
              pGVar29 = (context->scene->geometries).items[uVar143].ptr;
              uVar147 = (ray->super_RayK<1>).mask;
              pRVar132 = (RTCRayN *)(ulong)uVar147;
              if ((pGVar29->mask & uVar147) != 0) {
                fVar439 = fVar439 * 1.5 + fVar439 * fVar439 * auVar396._0_4_ * -0.5 * fVar439;
                fVar355 = fVar355 * fVar439;
                fVar367 = fVar367 * fVar439;
                fVar379 = fVar379 * fVar439;
                fVar439 = fVar399 * fVar355 + fVar401;
                fVar462 = fVar399 * fVar367 + fVar354;
                fVar468 = fVar399 * fVar379 + fVar404;
                fVar283 = fVar367 * fVar401 - fVar354 * fVar355;
                fVar285 = fVar379 * fVar354 - fVar404 * fVar367;
                fVar286 = fVar355 * fVar404 - fVar401 * fVar379;
                fVar282 = fVar462 * fVar285 - fVar286 * fVar439;
                uVar210 = CONCAT44(fVar439 * fVar283 - fVar285 * fVar468,
                                   fVar468 * fVar286 - fVar283 * fVar462);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar280;
                  *(undefined8 *)&(ray->Ng).field_0 = uVar210;
                  (ray->Ng).field_0.field_0.z = fVar282;
                  ray->u = fVar259;
                  ray->v = 0.0;
                  ray->primID = uVar145;
                  ray->geomID = uVar143;
                  ray->instID[0] = context->user->instID[0];
                  uVar147 = context->user->instPrimID[0];
                  ray->instPrimID[0] = uVar147;
                  pRVar132 = (RTCRayN *)(ulong)uVar147;
                }
                else {
                  vu0.field_0._0_8_ = uVar210;
                  vu0.field_0.v[2] = fVar282;
                  vu0.field_0.v[3] = fVar259;
                  pRVar135 = (RTCIntersectArguments *)(ulong)context->user->instID[0];
                  (ray->super_RayK<1>).tfar = fVar280;
                  local_51c = -1;
                  args.geometryUserPtr = pGVar29->userPtr;
                  args.valid = &local_51c;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  uStack_4f4 = fVar465;
                  if (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00377a01:
                    pRVar135 = context->args;
                    fVar465 = uStack_4f4;
                    if ((pRVar135->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar135->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar135->filter)(&args);
                      pRVar137 = extraout_RDX_04;
                      auVar168 = _DAT_01f46710;
                      fVar465 = uStack_4f4;
                      if (*args.valid == 0) goto LAB_00377a9c;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    pRVar137 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    pRVar135 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                    *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                    pRVar132 = args.ray;
                  }
                  else {
                    (*pGVar29->intersectionFilterN)(&args);
                    pRVar137 = extraout_RDX_03;
                    auVar168 = _DAT_01f46710;
                    fVar465 = uStack_4f4;
                    if (*args.valid != 0) goto LAB_00377a01;
LAB_00377a9c:
                    auVar168 = _DAT_01f46710;
                    (ray->super_RayK<1>).tfar = fVar436;
                    pRVar132 = (RTCRayN *)args.valid;
                  }
                }
              }
            }
LAB_003778f0:
            fVar283 = (ray->super_RayK<1>).tfar;
            auVar242._0_4_ = -(uint)(fVar452 <= fVar283) & local_388._0_4_;
            auVar242._4_4_ = -(uint)(fVar459 <= fVar283) & local_388._4_4_;
            auVar242._8_4_ = -(uint)(fVar425 <= fVar283) & local_388._8_4_;
            auVar242._12_4_ = -(uint)(fVar432 <= fVar283) & local_388._12_4_;
          }
          auVar312._4_4_ = -(uint)(fVar288 + fVar442 <= fVar283);
          auVar312._0_4_ = -(uint)(fVar288 + fVar431 <= fVar283);
          auVar312._8_4_ = -(uint)(fVar288 + fVar447 <= fVar283);
          auVar312._12_4_ = -(uint)(fVar288 + fVar449 <= fVar283);
          auVar312 = _local_518 & auVar303 & auVar312;
          auVar196._0_4_ =
               auVar241._0_4_ & auVar273._0_4_ &
               -(uint)(fVar288 + tp1.lower.field_0.v[0] <= fVar283);
          auVar196._4_4_ =
               auVar241._4_4_ & auVar273._4_4_ &
               -(uint)(fVar288 + tp1.lower.field_0.v[1] <= fVar283);
          auVar196._8_4_ =
               auVar241._8_4_ & auVar273._8_4_ &
               -(uint)(fVar288 + tp1.lower.field_0.v[2] <= fVar283);
          auVar196._12_4_ =
               auVar241._12_4_ & auVar273._12_4_ &
               -(uint)(fVar288 + tp1.lower.field_0.v[3] <= fVar283);
          iVar153 = movmskps(0,auVar196 | auVar312);
          pRVar136 = pRVar135;
          uStack_4f4 = fVar465;
          if (iVar153 != 0) {
            stack[(long)pRVar138].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar196 | auVar312);
            stack[(long)pRVar138].tlower.field_0.i[0] =
                 ~auVar312._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar431 & auVar312._0_4_;
            stack[(long)pRVar138].tlower.field_0.i[1] =
                 ~auVar312._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar442 & auVar312._4_4_;
            stack[(long)pRVar138].tlower.field_0.i[2] =
                 ~auVar312._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar447 & auVar312._8_4_;
            stack[(long)pRVar138].tlower.field_0.i[3] =
                 ~auVar312._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar449 & auVar312._12_4_;
            stack[(long)pRVar138].u0 = fVar435;
            stack[(long)pRVar138].u1 = fVar209;
            stack[(long)pRVar138].depth = (int)local_60c + 1U;
            pRVar138 = (RTCIntersectArguments *)(ulong)((int)pRVar138 + 1);
            pRVar136 = (RTCIntersectArguments *)(ulong)((int)local_60c + 1U);
          }
        }
      }
    }
    fVar435 = (ray->super_RayK<1>).tfar;
    do {
      pRVar139 = pRVar138;
      iVar153 = (int)pRVar139;
      if (iVar153 == 0) {
        auVar198._4_4_ = -(uint)(fVar344 <= fVar435);
        auVar198._0_4_ = -(uint)(fVar315 <= fVar435);
        auVar198._8_4_ = -(uint)(fVar207 <= fVar435);
        auVar198._12_4_ = -(uint)(fVar208 <= fVar435);
        uVar143 = movmskps((int)pRVar136,auVar198);
        local_340 = (ulong)((uint)local_340 - 1 & (uint)local_340 & uVar143);
        goto LAB_0037549a;
      }
      pRVar136 = (RTCIntersectArguments *)(ulong)(iVar153 - 1U);
      fVar209 = stack[(long)pRVar136].tlower.field_0.v[0];
      fVar431 = stack[(long)pRVar136].tlower.field_0.v[1];
      fVar442 = stack[(long)pRVar136].tlower.field_0.v[2];
      fVar447 = stack[(long)pRVar136].tlower.field_0.v[3];
      args.valid._0_4_ =
           -(uint)(fVar288 + fVar209 <= fVar435) & stack[(long)pRVar136].valid.field_0.i[0];
      args.valid._4_4_ =
           -(uint)(fVar288 + fVar431 <= fVar435) & stack[(long)pRVar136].valid.field_0.i[1];
      args.geometryUserPtr._0_4_ =
           -(uint)(fVar288 + fVar442 <= fVar435) & stack[(long)pRVar136].valid.field_0.i[2];
      args.geometryUserPtr._4_4_ =
           -(uint)(fVar288 + fVar447 <= fVar435) & stack[(long)pRVar136].valid.field_0.i[3];
      uVar147 = movmskps((int)pRVar137,(undefined1  [16])args._0_16_);
      pRVar137 = (RTCIntersectArguments *)(ulong)uVar147;
      pRVar138 = pRVar136;
    } while (uVar147 == 0);
    auVar256._0_4_ = (uint)fVar209 & (uint)args.valid;
    auVar256._4_4_ = (uint)fVar431 & args.valid._4_4_;
    auVar256._8_4_ = (uint)fVar442 & (uint)args.geometryUserPtr;
    auVar256._12_4_ = (uint)fVar447 & args.geometryUserPtr._4_4_;
    auVar276._0_8_ = CONCAT44(~args.valid._4_4_,~(uint)args.valid) & 0x7f8000007f800000;
    auVar276._8_4_ = ~(uint)args.geometryUserPtr & 0x7f800000;
    auVar276._12_4_ = ~args.geometryUserPtr._4_4_ & 0x7f800000;
    auVar276 = auVar276 | auVar256;
    auVar257._4_4_ = auVar276._0_4_;
    auVar257._0_4_ = auVar276._4_4_;
    auVar257._8_4_ = auVar276._12_4_;
    auVar257._12_4_ = auVar276._8_4_;
    auVar168 = minps(auVar257,auVar276);
    auVar244._0_8_ = auVar168._8_8_;
    auVar244._8_4_ = auVar168._0_4_;
    auVar244._12_4_ = auVar168._4_4_;
    auVar168 = minps(auVar244,auVar168);
    auVar245._0_8_ =
         CONCAT44(-(uint)(auVar168._4_4_ == auVar276._4_4_) & args.valid._4_4_,
                  -(uint)(auVar168._0_4_ == auVar276._0_4_) & (uint)args.valid);
    auVar245._8_4_ = -(uint)(auVar168._8_4_ == auVar276._8_4_) & (uint)args.geometryUserPtr;
    auVar245._12_4_ = -(uint)(auVar168._12_4_ == auVar276._12_4_) & args.geometryUserPtr._4_4_;
    iVar203 = movmskps(iVar153 - 1U,auVar245);
    auVar197 = (undefined1  [16])args._0_16_;
    if (iVar203 != 0) {
      auVar197._8_4_ = auVar245._8_4_;
      auVar197._0_8_ = auVar245._0_8_;
      auVar197._12_4_ = auVar245._12_4_;
    }
    pSVar131 = stack + (long)pRVar136;
    uVar147 = movmskps(iVar203,auVar197);
    pRVar135 = (RTCIntersectArguments *)0x0;
    if (uVar147 != 0) {
      for (; (uVar147 >> (long)pRVar135 & 1) == 0;
          pRVar135 = (RTCIntersectArguments *)((long)&pRVar135->flags + 1)) {
      }
    }
    *(undefined4 *)((long)&args.valid + (long)pRVar135 * 4) = 0;
    uVar10 = stack[(long)pRVar136].u0;
    uVar20 = stack[(long)pRVar136].u1;
    local_60c = (float)stack[(long)pRVar136].depth;
    iVar203 = movmskps(local_60c,(undefined1  [16])args._0_16_);
    pRVar137 = (RTCIntersectArguments *)(ulong)(iVar153 - 1);
    if (iVar203 != 0) {
      pRVar137 = pRVar139;
    }
    (pSVar131->valid).field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)args._0_16_;
    fVar435 = (float)uVar20 - (float)uVar10;
    vu0.field_0.v[1] = fVar435 * 0.33333334 + (float)uVar10;
    vu0.field_0.v[0] = fVar435 * 0.0 + (float)uVar10;
    vu0.field_0.v[2] = fVar435 * 0.6666667 + (float)uVar10;
    vu0.field_0.v[3] = fVar435 * 1.0 + (float)uVar10;
    fVar435 = vu0.field_0.v[(long)pRVar135];
    fVar209 = *(float *)((long)&vu0.field_0 + (long)pRVar135 * 4 + 4);
    pRVar138 = pRVar137;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }